

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  void *pvVar5;
  __int_type_conflict _Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  bool bVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint uVar50;
  uint uVar51;
  uint uVar52;
  int iVar53;
  ulong uVar54;
  long lVar56;
  byte bVar57;
  uint uVar58;
  ulong uVar59;
  bool bVar60;
  ulong uVar61;
  bool bVar62;
  float fVar63;
  float fVar73;
  vint4 bi_2;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined4 uVar64;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  float fVar74;
  float fVar91;
  vint4 bi_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  vint4 ai_2;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar117;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  vint4 ai;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar133;
  float fVar134;
  float fVar149;
  float fVar150;
  vint4 bi;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar151;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar152;
  float fVar153;
  undefined1 auVar148 [32];
  float fVar154;
  undefined8 uVar155;
  float fVar175;
  vfloat4 b0_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar173;
  float fVar177;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar174;
  float fVar176;
  float fVar178;
  undefined1 auVar172 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  vint4 ai_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  vfloat4 a0_2;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  float fVar230;
  vfloat4 a0_3;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar231;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  float fVar244;
  float fVar255;
  float fVar256;
  vfloat4 a0_1;
  undefined1 auVar245 [16];
  float fVar257;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  vfloat4 a0;
  undefined1 auVar258 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar259 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_669;
  undefined1 local_5f8 [8];
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_598;
  float fStack_594;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 *local_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  uint auStack_408 [4];
  RTCFilterFunctionNArguments local_3f8;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar55;
  undefined1 auVar114 [32];
  
  PVar2 = prim[1];
  uVar61 = (ulong)(byte)PVar2;
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar63 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  auVar123._0_4_ = fVar63 * auVar7._0_4_;
  auVar123._4_4_ = fVar63 * auVar7._4_4_;
  auVar123._8_4_ = fVar63 * auVar7._8_4_;
  auVar123._12_4_ = fVar63 * auVar7._12_4_;
  auVar135._0_4_ = fVar63 * auVar70._0_4_;
  auVar135._4_4_ = fVar63 * auVar70._4_4_;
  auVar135._8_4_ = fVar63 * auVar70._8_4_;
  auVar135._12_4_ = fVar63 * auVar70._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar273 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar273 = vcvtdq2ps_avx(auVar273);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar61 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  uVar54 = (ulong)(uint)((int)(uVar61 * 9) * 2);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + uVar61 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  uVar54 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar268._4_4_ = auVar135._0_4_;
  auVar268._0_4_ = auVar135._0_4_;
  auVar268._8_4_ = auVar135._0_4_;
  auVar268._12_4_ = auVar135._0_4_;
  auVar76 = vshufps_avx(auVar135,auVar135,0x55);
  auVar201 = vshufps_avx(auVar135,auVar135,0xaa);
  fVar63 = auVar201._0_4_;
  auVar235._0_4_ = fVar63 * auVar273._0_4_;
  fVar73 = auVar201._4_4_;
  auVar235._4_4_ = fVar73 * auVar273._4_4_;
  fVar133 = auVar201._8_4_;
  auVar235._8_4_ = fVar133 * auVar273._8_4_;
  fVar149 = auVar201._12_4_;
  auVar235._12_4_ = fVar149 * auVar273._12_4_;
  auVar221._0_4_ = auVar10._0_4_ * fVar63;
  auVar221._4_4_ = auVar10._4_4_ * fVar73;
  auVar221._8_4_ = auVar10._8_4_ * fVar133;
  auVar221._12_4_ = auVar10._12_4_ * fVar149;
  auVar195._0_4_ = auVar92._0_4_ * fVar63;
  auVar195._4_4_ = auVar92._4_4_ * fVar73;
  auVar195._8_4_ = auVar92._8_4_ * fVar133;
  auVar195._12_4_ = auVar92._12_4_ * fVar149;
  auVar201 = vfmadd231ps_fma(auVar235,auVar76,auVar70);
  auVar77 = vfmadd231ps_fma(auVar221,auVar76,auVar9);
  auVar76 = vfmadd231ps_fma(auVar195,auVar65,auVar76);
  auVar106 = vfmadd231ps_fma(auVar201,auVar268,auVar7);
  auVar77 = vfmadd231ps_fma(auVar77,auVar268,auVar8);
  auVar119 = vfmadd231ps_fma(auVar76,auVar66,auVar268);
  auVar269._4_4_ = auVar123._0_4_;
  auVar269._0_4_ = auVar123._0_4_;
  auVar269._8_4_ = auVar123._0_4_;
  auVar269._12_4_ = auVar123._0_4_;
  auVar76 = vshufps_avx(auVar123,auVar123,0x55);
  auVar201 = vshufps_avx(auVar123,auVar123,0xaa);
  fVar63 = auVar201._0_4_;
  auVar136._0_4_ = fVar63 * auVar273._0_4_;
  fVar73 = auVar201._4_4_;
  auVar136._4_4_ = fVar73 * auVar273._4_4_;
  fVar133 = auVar201._8_4_;
  auVar136._8_4_ = fVar133 * auVar273._8_4_;
  fVar149 = auVar201._12_4_;
  auVar136._12_4_ = fVar149 * auVar273._12_4_;
  auVar75._0_4_ = auVar10._0_4_ * fVar63;
  auVar75._4_4_ = auVar10._4_4_ * fVar73;
  auVar75._8_4_ = auVar10._8_4_ * fVar133;
  auVar75._12_4_ = auVar10._12_4_ * fVar149;
  auVar201._0_4_ = auVar92._0_4_ * fVar63;
  auVar201._4_4_ = auVar92._4_4_ * fVar73;
  auVar201._8_4_ = auVar92._8_4_ * fVar133;
  auVar201._12_4_ = auVar92._12_4_ * fVar149;
  auVar70 = vfmadd231ps_fma(auVar136,auVar76,auVar70);
  auVar273 = vfmadd231ps_fma(auVar75,auVar76,auVar9);
  auVar9 = vfmadd231ps_fma(auVar201,auVar76,auVar65);
  auVar10 = vfmadd231ps_fma(auVar70,auVar269,auVar7);
  auVar65 = vfmadd231ps_fma(auVar273,auVar269,auVar8);
  auVar92 = vfmadd231ps_fma(auVar9,auVar269,auVar66);
  auVar182._8_4_ = 0x7fffffff;
  auVar182._0_8_ = 0x7fffffff7fffffff;
  auVar182._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar106,auVar182);
  auVar118._8_4_ = 0x219392ef;
  auVar118._0_8_ = 0x219392ef219392ef;
  auVar118._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar118,1);
  auVar70 = vblendvps_avx(auVar106,auVar118,auVar7);
  auVar7 = vandps_avx(auVar77,auVar182);
  auVar7 = vcmpps_avx(auVar7,auVar118,1);
  auVar273 = vblendvps_avx(auVar77,auVar118,auVar7);
  auVar7 = vandps_avx(auVar119,auVar182);
  auVar7 = vcmpps_avx(auVar7,auVar118,1);
  auVar7 = vblendvps_avx(auVar119,auVar118,auVar7);
  auVar8 = vrcpps_avx(auVar70);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = &DAT_3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar70 = vfnmadd213ps_fma(auVar70,auVar8,auVar183);
  auVar8 = vfmadd132ps_fma(auVar70,auVar8,auVar8);
  auVar70 = vrcpps_avx(auVar273);
  auVar273 = vfnmadd213ps_fma(auVar273,auVar70,auVar183);
  auVar9 = vfmadd132ps_fma(auVar273,auVar70,auVar70);
  auVar70 = vrcpps_avx(auVar7);
  auVar273 = vfnmadd213ps_fma(auVar7,auVar70,auVar183);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar66 = vfmadd132ps_fma(auVar273,auVar70,auVar70);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar10);
  auVar119._0_4_ = auVar8._0_4_ * auVar7._0_4_;
  auVar119._4_4_ = auVar8._4_4_ * auVar7._4_4_;
  auVar119._8_4_ = auVar8._8_4_ * auVar7._8_4_;
  auVar119._12_4_ = auVar8._12_4_ * auVar7._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar70);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar10);
  auVar137._0_4_ = auVar8._0_4_ * auVar7._0_4_;
  auVar137._4_4_ = auVar8._4_4_ * auVar7._4_4_;
  auVar137._8_4_ = auVar8._8_4_ * auVar7._8_4_;
  auVar137._12_4_ = auVar8._12_4_ * auVar7._12_4_;
  auVar77._1_3_ = 0;
  auVar77[0] = PVar2;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar70 = vpmovsxwd_avx(auVar273);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar61 * -2 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar65);
  auVar196._0_4_ = auVar7._0_4_ * auVar9._0_4_;
  auVar196._4_4_ = auVar7._4_4_ * auVar9._4_4_;
  auVar196._8_4_ = auVar7._8_4_ * auVar9._8_4_;
  auVar196._12_4_ = auVar7._12_4_ * auVar9._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar70);
  auVar7 = vsubps_avx(auVar7,auVar65);
  auVar76._0_4_ = auVar9._0_4_ * auVar7._0_4_;
  auVar76._4_4_ = auVar9._4_4_ * auVar7._4_4_;
  auVar76._8_4_ = auVar9._8_4_ * auVar7._8_4_;
  auVar76._12_4_ = auVar9._12_4_ * auVar7._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar54 + uVar61 + 6);
  auVar7 = vpmovsxwd_avx(auVar9);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar92);
  auVar106._0_4_ = auVar66._0_4_ * auVar7._0_4_;
  auVar106._4_4_ = auVar66._4_4_ * auVar7._4_4_;
  auVar106._8_4_ = auVar66._8_4_ * auVar7._8_4_;
  auVar106._12_4_ = auVar66._12_4_ * auVar7._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar61 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar92);
  auVar65._0_4_ = auVar66._0_4_ * auVar7._0_4_;
  auVar65._4_4_ = auVar66._4_4_ * auVar7._4_4_;
  auVar65._8_4_ = auVar66._8_4_ * auVar7._8_4_;
  auVar65._12_4_ = auVar66._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar119,auVar137);
  auVar70 = vpminsd_avx(auVar196,auVar76);
  auVar7 = vmaxps_avx(auVar7,auVar70);
  auVar70 = vpminsd_avx(auVar106,auVar65);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar212._4_4_ = uVar64;
  auVar212._0_4_ = uVar64;
  auVar212._8_4_ = uVar64;
  auVar212._12_4_ = uVar64;
  auVar70 = vmaxps_avx(auVar70,auVar212);
  auVar7 = vmaxps_avx(auVar7,auVar70);
  local_368._0_4_ = auVar7._0_4_ * 0.99999964;
  local_368._4_4_ = auVar7._4_4_ * 0.99999964;
  local_368._8_4_ = auVar7._8_4_ * 0.99999964;
  local_368._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar119,auVar137);
  auVar70 = vpmaxsd_avx(auVar196,auVar76);
  auVar7 = vminps_avx(auVar7,auVar70);
  auVar70 = vpmaxsd_avx(auVar106,auVar65);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar92._4_4_ = uVar64;
  auVar92._0_4_ = uVar64;
  auVar92._8_4_ = uVar64;
  auVar92._12_4_ = uVar64;
  auVar70 = vminps_avx(auVar70,auVar92);
  auVar7 = vminps_avx(auVar7,auVar70);
  auVar66._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar66._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar66._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar66._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar77[4] = PVar2;
  auVar77._5_3_ = 0;
  auVar77[8] = PVar2;
  auVar77._9_3_ = 0;
  auVar77[0xc] = PVar2;
  auVar77._13_3_ = 0;
  auVar70 = vpcmpgtd_avx(auVar77,_DAT_01ff0cf0);
  auVar7 = vcmpps_avx(local_368,auVar66,2);
  auVar7 = vandps_avx(auVar7,auVar70);
  uVar50 = vmovmskps_avx(auVar7);
  local_669 = uVar50 != 0;
  if (uVar50 == 0) {
    return local_669;
  }
  uVar50 = uVar50 & 0xff;
  auVar72._16_16_ = mm_lookupmask_ps._240_16_;
  auVar72._0_16_ = mm_lookupmask_ps._240_16_;
  local_288 = vblendps_avx(auVar72,ZEXT832(0) << 0x20,0x80);
  local_510 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_01657004:
  lVar56 = 0;
  uVar61 = (ulong)uVar50;
  for (uVar54 = uVar61; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar56 = lVar56 + 1;
  }
  uVar50 = *(uint *)(prim + 2);
  local_388 = *(uint *)(prim + lVar56 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar50].ptr;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_388);
  p_Var4 = pGVar3[1].intersectionFilterN;
  pvVar5 = pGVar3[2].userPtr;
  _Var6 = pGVar3[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar7 = *(undefined1 (*) [16])(_Var6 + uVar54 * (long)pvVar5);
  auVar70 = *(undefined1 (*) [16])(_Var6 + (uVar54 + 1) * (long)pvVar5);
  auVar273 = *(undefined1 (*) [16])(_Var6 + (uVar54 + 2) * (long)pvVar5);
  auVar8 = *(undefined1 (*) [16])(_Var6 + (long)pvVar5 * (uVar54 + 3));
  lVar56 = *(long *)&pGVar3[1].time_range.upper;
  auVar9 = *(undefined1 (*) [16])(lVar56 + (long)p_Var4 * uVar54);
  auVar10 = *(undefined1 (*) [16])(lVar56 + (long)p_Var4 * (uVar54 + 1));
  auVar66 = *(undefined1 (*) [16])(lVar56 + (long)p_Var4 * (uVar54 + 2));
  uVar61 = uVar61 - 1 & uVar61;
  auVar65 = *(undefined1 (*) [16])(lVar56 + (long)p_Var4 * (uVar54 + 3));
  if (uVar61 != 0) {
    uVar59 = uVar61 - 1 & uVar61;
    for (uVar54 = uVar61; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    }
    if (uVar59 != 0) {
      for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar106 = ZEXT816(0) << 0x40;
  auVar78._0_4_ = auVar65._0_4_ * 0.0;
  auVar78._4_4_ = auVar65._4_4_ * 0.0;
  auVar78._8_4_ = auVar65._8_4_ * 0.0;
  auVar78._12_4_ = auVar65._12_4_ * 0.0;
  auVar201 = vfmadd231ps_fma(auVar78,auVar66,auVar106);
  auVar76 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar10,auVar201);
  local_5d8._0_4_ = auVar9._0_4_ + auVar76._0_4_;
  local_5d8._4_4_ = auVar9._4_4_ + auVar76._4_4_;
  fStack_5d0 = auVar9._8_4_ + auVar76._8_4_;
  fStack_5cc = auVar9._12_4_ + auVar76._12_4_;
  auVar270._8_4_ = 0x40400000;
  auVar270._0_8_ = 0x4040000040400000;
  auVar270._12_4_ = 0x40400000;
  auVar76 = vfmadd231ps_fma(auVar201,auVar10,auVar270);
  auVar77 = vfnmadd231ps_fma(auVar76,auVar9,auVar270);
  auVar245._0_4_ = auVar8._0_4_ * 0.0;
  auVar245._4_4_ = auVar8._4_4_ * 0.0;
  auVar245._8_4_ = auVar8._8_4_ * 0.0;
  auVar245._12_4_ = auVar8._12_4_ * 0.0;
  auVar201 = vfmadd231ps_fma(auVar245,auVar273,auVar106);
  auVar76 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar70,auVar201);
  auVar258._0_4_ = auVar7._0_4_ + auVar76._0_4_;
  auVar258._4_4_ = auVar7._4_4_ + auVar76._4_4_;
  auVar258._8_4_ = auVar7._8_4_ + auVar76._8_4_;
  auVar258._12_4_ = auVar7._12_4_ + auVar76._12_4_;
  auVar76 = vfmadd231ps_fma(auVar201,auVar70,auVar270);
  auVar201 = vfnmadd231ps_fma(auVar76,auVar7,auVar270);
  auVar76 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar66,auVar65);
  auVar76 = vfmadd231ps_fma(auVar76,auVar10,auVar106);
  auVar76 = vfmadd231ps_fma(auVar76,auVar9,auVar106);
  auVar120._0_4_ = auVar65._0_4_ * 3.0;
  auVar120._4_4_ = auVar65._4_4_ * 3.0;
  auVar120._8_4_ = auVar65._8_4_ * 3.0;
  auVar120._12_4_ = auVar65._12_4_ * 3.0;
  auVar66 = vfnmadd231ps_fma(auVar120,auVar270,auVar66);
  auVar10 = vfmadd231ps_fma(auVar66,auVar106,auVar10);
  auVar66 = vfnmadd231ps_fma(auVar10,auVar106,auVar9);
  auVar9 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar273,auVar8);
  auVar9 = vfmadd231ps_fma(auVar9,auVar70,auVar106);
  auVar9 = vfmadd231ps_fma(auVar9,auVar7,auVar106);
  auVar222._0_4_ = auVar8._0_4_ * 3.0;
  auVar222._4_4_ = auVar8._4_4_ * 3.0;
  auVar222._8_4_ = auVar8._8_4_ * 3.0;
  auVar222._12_4_ = auVar8._12_4_ * 3.0;
  auVar273 = vfnmadd231ps_fma(auVar222,auVar270,auVar273);
  auVar70 = vfmadd231ps_fma(auVar273,auVar106,auVar70);
  auVar10 = vfnmadd231ps_fma(auVar70,auVar106,auVar7);
  auVar7 = vshufps_avx(auVar77,auVar77,0xc9);
  auVar70 = vshufps_avx(auVar258,auVar258,0xc9);
  fVar150 = auVar77._0_4_;
  auVar156._0_4_ = fVar150 * auVar70._0_4_;
  fVar151 = auVar77._4_4_;
  auVar156._4_4_ = fVar151 * auVar70._4_4_;
  fVar91 = auVar77._8_4_;
  auVar156._8_4_ = fVar91 * auVar70._8_4_;
  fVar74 = auVar77._12_4_;
  auVar156._12_4_ = fVar74 * auVar70._12_4_;
  auVar70 = vfmsub231ps_fma(auVar156,auVar7,auVar258);
  auVar273 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar70 = vshufps_avx(auVar201,auVar201,0xc9);
  auVar157._0_4_ = fVar150 * auVar70._0_4_;
  auVar157._4_4_ = fVar151 * auVar70._4_4_;
  auVar157._8_4_ = fVar91 * auVar70._8_4_;
  auVar157._12_4_ = fVar74 * auVar70._12_4_;
  auVar7 = vfmsub231ps_fma(auVar157,auVar7,auVar201);
  auVar8 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar7 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar70 = vshufps_avx(auVar9,auVar9,0xc9);
  fVar134 = auVar66._0_4_;
  auVar138._0_4_ = fVar134 * auVar70._0_4_;
  fVar117 = auVar66._4_4_;
  auVar138._4_4_ = fVar117 * auVar70._4_4_;
  fVar152 = auVar66._8_4_;
  auVar138._8_4_ = fVar152 * auVar70._8_4_;
  fVar153 = auVar66._12_4_;
  auVar138._12_4_ = fVar153 * auVar70._12_4_;
  auVar70 = vfmsub231ps_fma(auVar138,auVar7,auVar9);
  auVar9 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar70 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar184._0_4_ = fVar134 * auVar70._0_4_;
  auVar184._4_4_ = fVar117 * auVar70._4_4_;
  auVar184._8_4_ = fVar152 * auVar70._8_4_;
  auVar184._12_4_ = fVar153 * auVar70._12_4_;
  auVar7 = vfmsub231ps_fma(auVar184,auVar7,auVar10);
  auVar10 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar7 = vdpps_avx(auVar273,auVar273,0x7f);
  fVar73 = auVar7._0_4_;
  auVar223._4_12_ = ZEXT812(0) << 0x20;
  auVar223._0_4_ = fVar73;
  auVar70 = vrsqrtss_avx(auVar223,auVar223);
  fVar63 = auVar70._0_4_;
  fVar133 = fVar63 * 1.5 - fVar73 * 0.5 * fVar63 * fVar63 * fVar63;
  auVar70 = vdpps_avx(auVar273,auVar8,0x7f);
  fVar154 = auVar273._0_4_ * fVar133;
  fVar173 = auVar273._4_4_ * fVar133;
  fVar175 = auVar273._8_4_ * fVar133;
  fVar177 = auVar273._12_4_ * fVar133;
  auVar236._0_4_ = auVar8._0_4_ * fVar73;
  auVar236._4_4_ = auVar8._4_4_ * fVar73;
  auVar236._8_4_ = auVar8._8_4_ * fVar73;
  auVar236._12_4_ = auVar8._12_4_ * fVar73;
  fVar63 = auVar70._0_4_;
  auVar197._0_4_ = auVar273._0_4_ * fVar63;
  auVar197._4_4_ = auVar273._4_4_ * fVar63;
  auVar197._8_4_ = auVar273._8_4_ * fVar63;
  auVar197._12_4_ = auVar273._12_4_ * fVar63;
  auVar273 = vsubps_avx(auVar236,auVar197);
  auVar70 = vrcpss_avx(auVar223,auVar223);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar70,SUB6416(ZEXT464(0x40000000),0));
  fVar63 = auVar70._0_4_ * auVar7._0_4_;
  auVar7 = vdpps_avx(auVar9,auVar9,0x7f);
  fVar73 = auVar7._0_4_;
  auVar224._4_12_ = ZEXT812(0) << 0x20;
  auVar224._0_4_ = fVar73;
  auVar70 = vrsqrtss_avx(auVar224,auVar224);
  fVar149 = auVar70._0_4_;
  auVar70 = vdpps_avx(auVar9,auVar10,0x7f);
  fVar149 = fVar149 * 1.5 - fVar73 * 0.5 * fVar149 * fVar149 * fVar149;
  fVar244 = fVar149 * auVar9._0_4_;
  fVar255 = fVar149 * auVar9._4_4_;
  fVar256 = fVar149 * auVar9._8_4_;
  fVar257 = fVar149 * auVar9._12_4_;
  auVar185._0_4_ = fVar73 * auVar10._0_4_;
  auVar185._4_4_ = fVar73 * auVar10._4_4_;
  auVar185._8_4_ = fVar73 * auVar10._8_4_;
  auVar185._12_4_ = fVar73 * auVar10._12_4_;
  fVar73 = auVar70._0_4_;
  auVar139._0_4_ = fVar73 * auVar9._0_4_;
  auVar139._4_4_ = fVar73 * auVar9._4_4_;
  auVar139._8_4_ = fVar73 * auVar9._8_4_;
  auVar139._12_4_ = fVar73 * auVar9._12_4_;
  auVar8 = vsubps_avx(auVar185,auVar139);
  auVar70 = vrcpss_avx(auVar224,auVar224);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar70,ZEXT416(0x40000000));
  fVar73 = auVar7._0_4_ * auVar70._0_4_;
  auVar7 = vshufps_avx(_local_5d8,_local_5d8,0xff);
  auVar213._0_4_ = auVar7._0_4_ * fVar154;
  auVar213._4_4_ = auVar7._4_4_ * fVar173;
  auVar213._8_4_ = auVar7._8_4_ * fVar175;
  auVar213._12_4_ = auVar7._12_4_ * fVar177;
  local_4a8 = vsubps_avx(_local_5d8,auVar213);
  auVar70 = vshufps_avx(auVar77,auVar77,0xff);
  auVar158._0_4_ = auVar70._0_4_ * fVar154 + fVar133 * auVar273._0_4_ * fVar63 * auVar7._0_4_;
  auVar158._4_4_ = auVar70._4_4_ * fVar173 + fVar133 * auVar273._4_4_ * fVar63 * auVar7._4_4_;
  auVar158._8_4_ = auVar70._8_4_ * fVar175 + fVar133 * auVar273._8_4_ * fVar63 * auVar7._8_4_;
  auVar158._12_4_ = auVar70._12_4_ * fVar177 + fVar133 * auVar273._12_4_ * fVar63 * auVar7._12_4_;
  auVar273 = vsubps_avx(auVar77,auVar158);
  local_4b8._0_4_ = auVar213._0_4_ + (float)local_5d8._0_4_;
  local_4b8._4_4_ = auVar213._4_4_ + (float)local_5d8._4_4_;
  fStack_4b0 = auVar213._8_4_ + fStack_5d0;
  fStack_4ac = auVar213._12_4_ + fStack_5cc;
  auVar7 = vshufps_avx(auVar76,auVar76,0xff);
  auVar93._0_4_ = fVar244 * auVar7._0_4_;
  auVar93._4_4_ = fVar255 * auVar7._4_4_;
  auVar93._8_4_ = fVar256 * auVar7._8_4_;
  auVar93._12_4_ = fVar257 * auVar7._12_4_;
  local_4c8 = vsubps_avx(auVar76,auVar93);
  auVar70 = vshufps_avx(auVar66,auVar66,0xff);
  auVar79._0_4_ = fVar244 * auVar70._0_4_ + auVar7._0_4_ * fVar149 * auVar8._0_4_ * fVar73;
  auVar79._4_4_ = fVar255 * auVar70._4_4_ + auVar7._4_4_ * fVar149 * auVar8._4_4_ * fVar73;
  auVar79._8_4_ = fVar256 * auVar70._8_4_ + auVar7._8_4_ * fVar149 * auVar8._8_4_ * fVar73;
  auVar79._12_4_ = fVar257 * auVar70._12_4_ + auVar7._12_4_ * fVar149 * auVar8._12_4_ * fVar73;
  auVar7 = vsubps_avx(auVar66,auVar79);
  fVar154 = auVar76._0_4_ + auVar93._0_4_;
  fVar173 = auVar76._4_4_ + auVar93._4_4_;
  fVar175 = auVar76._8_4_ + auVar93._8_4_;
  fVar177 = auVar76._12_4_ + auVar93._12_4_;
  local_4d8._0_4_ = local_4a8._0_4_ + auVar273._0_4_ * 0.33333334;
  local_4d8._4_4_ = local_4a8._4_4_ + auVar273._4_4_ * 0.33333334;
  local_4d8._8_4_ = local_4a8._8_4_ + auVar273._8_4_ * 0.33333334;
  local_4d8._12_4_ = local_4a8._12_4_ + auVar273._12_4_ * 0.33333334;
  auVar80._0_4_ = auVar7._0_4_ * 0.33333334;
  auVar80._4_4_ = auVar7._4_4_ * 0.33333334;
  auVar80._8_4_ = auVar7._8_4_ * 0.33333334;
  auVar80._12_4_ = auVar7._12_4_ * 0.33333334;
  local_4e8 = vsubps_avx(local_4c8,auVar80);
  local_488 = vsubps_avx(local_4a8,auVar92);
  auVar7 = vshufps_avx(local_488,local_488,0x55);
  auVar70 = vshufps_avx(local_488,local_488,0xaa);
  aVar1 = pre->ray_space[k].vy.field_0;
  fVar63 = pre->ray_space[k].vz.field_0.m128[0];
  fVar73 = pre->ray_space[k].vz.field_0.m128[1];
  fVar133 = pre->ray_space[k].vz.field_0.m128[2];
  fVar149 = pre->ray_space[k].vz.field_0.m128[3];
  auVar81._0_4_ = fVar63 * auVar70._0_4_;
  auVar81._4_4_ = fVar73 * auVar70._4_4_;
  auVar81._8_4_ = fVar133 * auVar70._8_4_;
  auVar81._12_4_ = fVar149 * auVar70._12_4_;
  auVar273 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar1,auVar7);
  local_498 = vsubps_avx(local_4d8,auVar92);
  auVar7 = vshufps_avx(local_498,local_498,0x55);
  auVar70 = vshufps_avx(local_498,local_498,0xaa);
  auVar278._0_4_ = fVar63 * auVar70._0_4_;
  auVar278._4_4_ = fVar73 * auVar70._4_4_;
  auVar278._8_4_ = fVar133 * auVar70._8_4_;
  auVar278._12_4_ = fVar149 * auVar70._12_4_;
  auVar70 = vfmadd231ps_fma(auVar278,(undefined1  [16])aVar1,auVar7);
  local_2f8 = vsubps_avx(local_4e8,auVar92);
  auVar7 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar246._0_4_ = fVar63 * auVar7._0_4_;
  auVar246._4_4_ = fVar73 * auVar7._4_4_;
  auVar246._8_4_ = fVar133 * auVar7._8_4_;
  auVar246._12_4_ = fVar149 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar8 = vfmadd231ps_fma(auVar246,(undefined1  [16])aVar1,auVar7);
  local_308 = vsubps_avx(local_4c8,auVar92);
  auVar7 = vshufps_avx(local_308,local_308,0xaa);
  auVar271._0_4_ = fVar63 * auVar7._0_4_;
  auVar271._4_4_ = fVar73 * auVar7._4_4_;
  auVar271._8_4_ = fVar133 * auVar7._8_4_;
  auVar271._12_4_ = fVar149 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_308,local_308,0x55);
  auVar9 = vfmadd231ps_fma(auVar271,(undefined1  [16])aVar1,auVar7);
  local_318 = vsubps_avx(_local_4b8,auVar92);
  auVar7 = vshufps_avx(local_318,local_318,0xaa);
  auVar140._0_4_ = fVar63 * auVar7._0_4_;
  auVar140._4_4_ = fVar73 * auVar7._4_4_;
  auVar140._8_4_ = fVar133 * auVar7._8_4_;
  auVar140._12_4_ = fVar149 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_318,local_318,0x55);
  auVar10 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar1,auVar7);
  local_4f8._0_4_ = (fVar150 + auVar158._0_4_) * 0.33333334 + (float)local_4b8._0_4_;
  local_4f8._4_4_ = (fVar151 + auVar158._4_4_) * 0.33333334 + (float)local_4b8._4_4_;
  fStack_4f0 = (fVar91 + auVar158._8_4_) * 0.33333334 + fStack_4b0;
  fStack_4ec = (fVar74 + auVar158._12_4_) * 0.33333334 + fStack_4ac;
  local_328 = vsubps_avx(_local_4f8,auVar92);
  auVar7 = vshufps_avx(local_328,local_328,0xaa);
  auVar198._0_4_ = auVar7._0_4_ * fVar63;
  auVar198._4_4_ = auVar7._4_4_ * fVar73;
  auVar198._8_4_ = auVar7._8_4_ * fVar133;
  auVar198._12_4_ = auVar7._12_4_ * fVar149;
  auVar7 = vshufps_avx(local_328,local_328,0x55);
  auVar66 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar1,auVar7);
  auVar214._0_4_ = (fVar134 + auVar79._0_4_) * 0.33333334;
  auVar214._4_4_ = (fVar117 + auVar79._4_4_) * 0.33333334;
  auVar214._8_4_ = (fVar152 + auVar79._8_4_) * 0.33333334;
  auVar214._12_4_ = (fVar153 + auVar79._12_4_) * 0.33333334;
  auVar43._4_4_ = fVar173;
  auVar43._0_4_ = fVar154;
  auVar43._8_4_ = fVar175;
  auVar43._12_4_ = fVar177;
  _local_508 = vsubps_avx(auVar43,auVar214);
  local_338 = vsubps_avx(_local_508,auVar92);
  auVar7 = vshufps_avx(local_338,local_338,0xaa);
  auVar215._0_4_ = auVar7._0_4_ * fVar63;
  auVar215._4_4_ = auVar7._4_4_ * fVar73;
  auVar215._8_4_ = auVar7._8_4_ * fVar133;
  auVar215._12_4_ = auVar7._12_4_ * fVar149;
  auVar7 = vshufps_avx(local_338,local_338,0x55);
  auVar65 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar1,auVar7);
  local_348 = vsubps_avx(auVar43,auVar92);
  auVar7 = vshufps_avx(local_348,local_348,0xaa);
  auVar67._0_4_ = fVar63 * auVar7._0_4_;
  auVar67._4_4_ = fVar73 * auVar7._4_4_;
  auVar67._8_4_ = fVar133 * auVar7._8_4_;
  auVar67._12_4_ = fVar149 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_348,local_348,0x55);
  auVar7 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar1,auVar7);
  auVar159._4_4_ = local_488._0_4_;
  auVar159._0_4_ = local_488._0_4_;
  auVar159._8_4_ = local_488._0_4_;
  auVar159._12_4_ = local_488._0_4_;
  aVar1 = pre->ray_space[k].vx.field_0;
  auVar92 = vfmadd231ps_fma(auVar273,(undefined1  [16])aVar1,auVar159);
  auVar160._4_4_ = local_498._0_4_;
  auVar160._0_4_ = local_498._0_4_;
  auVar160._8_4_ = local_498._0_4_;
  auVar160._12_4_ = local_498._0_4_;
  auVar76 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar1,auVar160);
  uVar64 = local_2f8._0_4_;
  auVar161._4_4_ = uVar64;
  auVar161._0_4_ = uVar64;
  auVar161._8_4_ = uVar64;
  auVar161._12_4_ = uVar64;
  auVar201 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar161);
  uVar64 = local_308._0_4_;
  auVar162._4_4_ = uVar64;
  auVar162._0_4_ = uVar64;
  auVar162._8_4_ = uVar64;
  auVar162._12_4_ = uVar64;
  auVar77 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar1,auVar162);
  uVar64 = local_318._0_4_;
  auVar163._4_4_ = uVar64;
  auVar163._0_4_ = uVar64;
  auVar163._8_4_ = uVar64;
  auVar163._12_4_ = uVar64;
  auVar106 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar1,auVar163);
  uVar64 = local_328._0_4_;
  auVar164._4_4_ = uVar64;
  auVar164._0_4_ = uVar64;
  auVar164._8_4_ = uVar64;
  auVar164._12_4_ = uVar64;
  auVar66 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar1,auVar164);
  uVar64 = local_338._0_4_;
  auVar165._4_4_ = uVar64;
  auVar165._0_4_ = uVar64;
  auVar165._8_4_ = uVar64;
  auVar165._12_4_ = uVar64;
  auVar65 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar165);
  uVar64 = local_348._0_4_;
  auVar166._4_4_ = uVar64;
  auVar166._0_4_ = uVar64;
  auVar166._8_4_ = uVar64;
  auVar166._12_4_ = uVar64;
  auVar119 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar1,auVar166);
  auVar8 = vmovlhps_avx(auVar92,auVar106);
  auVar9 = vmovlhps_avx(auVar76,auVar66);
  auVar10 = vmovlhps_avx(auVar201,auVar65);
  _local_2e8 = vmovlhps_avx(auVar77,auVar119);
  auVar7 = vminps_avx(auVar8,auVar9);
  auVar70 = vminps_avx(auVar10,_local_2e8);
  auVar273 = vminps_avx(auVar7,auVar70);
  auVar7 = vmaxps_avx(auVar8,auVar9);
  auVar70 = vmaxps_avx(auVar10,_local_2e8);
  auVar7 = vmaxps_avx(auVar7,auVar70);
  auVar70 = vshufpd_avx(auVar273,auVar273,3);
  auVar273 = vminps_avx(auVar273,auVar70);
  auVar70 = vshufpd_avx(auVar7,auVar7,3);
  auVar70 = vmaxps_avx(auVar7,auVar70);
  auVar7 = vandps_avx(auVar182,auVar273);
  auVar70 = vandps_avx(auVar182,auVar70);
  auVar7 = vmaxps_avx(auVar7,auVar70);
  auVar70 = vmovshdup_avx(auVar7);
  auVar7 = vmaxss_avx(auVar70,auVar7);
  fVar73 = auVar7._0_4_ * 9.536743e-07;
  auVar259._8_8_ = auVar92._0_8_;
  auVar259._0_8_ = auVar92._0_8_;
  local_418._8_8_ = auVar76._0_8_;
  local_418._0_8_ = auVar76._0_8_;
  local_428._0_8_ = auVar201._0_8_;
  local_428._8_8_ = local_428._0_8_;
  local_438._8_8_ = auVar77._0_8_;
  local_438._0_8_ = auVar77._0_8_;
  local_448 = auVar106._0_8_;
  register0x00001348 = local_448;
  register0x000013c8 = auVar66._0_8_;
  local_458 = auVar66._0_8_;
  register0x00001408 = auVar65._0_8_;
  local_468 = auVar65._0_8_;
  register0x00001448 = auVar119._0_8_;
  local_478 = auVar119._0_8_;
  local_198 = fVar73;
  fStack_194 = fVar73;
  fStack_190 = fVar73;
  fStack_18c = fVar73;
  fStack_188 = fVar73;
  fStack_184 = fVar73;
  fStack_180 = fVar73;
  fStack_17c = fVar73;
  local_1b8 = -fVar73;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  fStack_1a8 = local_1b8;
  fStack_1a4 = local_1b8;
  fStack_1a0 = local_1b8;
  fStack_19c = local_1b8;
  local_378 = uVar50;
  uStack_374 = uVar50;
  uStack_370 = uVar50;
  uStack_36c = uVar50;
  uStack_384 = local_388;
  uStack_380 = local_388;
  uStack_37c = local_388;
  bVar60 = false;
  uVar54 = 0;
  fVar63 = *(float *)(ray + k * 4 + 0x30);
  local_2b8 = vsubps_avx(auVar9,auVar8);
  local_2c8 = vsubps_avx(auVar10,auVar9);
  local_2d8 = vsubps_avx(_local_2e8,auVar10);
  local_398 = vsubps_avx(_local_4b8,local_4a8);
  local_3a8 = vsubps_avx(_local_4f8,local_4d8);
  local_3b8 = vsubps_avx(_local_508,local_4e8);
  auVar44._4_4_ = fVar173;
  auVar44._0_4_ = fVar154;
  auVar44._8_4_ = fVar175;
  auVar44._12_4_ = fVar177;
  _local_3c8 = vsubps_avx(auVar44,local_4c8);
  local_358 = ZEXT816(0x3f80000000000000);
  auVar284 = ZEXT1664(local_358);
  do {
    auVar135 = auVar284._0_16_;
    auVar7 = vshufps_avx(auVar135,auVar135,0x50);
    auVar107._8_4_ = 0x3f800000;
    auVar107._0_8_ = &DAT_3f8000003f800000;
    auVar107._12_4_ = 0x3f800000;
    auVar114._16_4_ = 0x3f800000;
    auVar114._0_16_ = auVar107;
    auVar114._20_4_ = 0x3f800000;
    auVar114._24_4_ = 0x3f800000;
    auVar114._28_4_ = 0x3f800000;
    auVar70 = vsubps_avx(auVar107,auVar7);
    fVar133 = auVar7._0_4_;
    auVar68._0_4_ = local_448._0_4_ * fVar133;
    fVar149 = auVar7._4_4_;
    auVar68._4_4_ = local_448._4_4_ * fVar149;
    fVar150 = auVar7._8_4_;
    auVar68._8_4_ = local_448._8_4_ * fVar150;
    fVar151 = auVar7._12_4_;
    auVar68._12_4_ = local_448._12_4_ * fVar151;
    auVar141._0_4_ = local_458._0_4_ * fVar133;
    auVar141._4_4_ = local_458._4_4_ * fVar149;
    auVar141._8_4_ = local_458._8_4_ * fVar150;
    auVar141._12_4_ = local_458._12_4_ * fVar151;
    auVar186._0_4_ = local_468._0_4_ * fVar133;
    auVar186._4_4_ = local_468._4_4_ * fVar149;
    auVar186._8_4_ = local_468._8_4_ * fVar150;
    auVar186._12_4_ = local_468._12_4_ * fVar151;
    auVar272._0_4_ = local_478._0_4_ * fVar133;
    auVar272._4_4_ = local_478._4_4_ * fVar149;
    auVar272._8_4_ = local_478._8_4_ * fVar150;
    auVar272._12_4_ = local_478._12_4_ * fVar151;
    auVar65 = vfmadd231ps_fma(auVar68,auVar70,auVar259);
    auVar92 = vfmadd231ps_fma(auVar141,auVar70,local_418);
    auVar76 = vfmadd231ps_fma(auVar186,auVar70,local_428);
    auVar201 = vfmadd231ps_fma(auVar272,local_438,auVar70);
    auVar7 = vmovshdup_avx(local_358);
    fVar133 = local_358._0_4_;
    fVar91 = (auVar7._0_4_ - fVar133) * 0.04761905;
    auVar211._4_4_ = fVar133;
    auVar211._0_4_ = fVar133;
    auVar211._8_4_ = fVar133;
    auVar211._12_4_ = fVar133;
    auVar211._16_4_ = fVar133;
    auVar211._20_4_ = fVar133;
    auVar211._24_4_ = fVar133;
    auVar211._28_4_ = fVar133;
    auVar103._0_8_ = auVar7._0_8_;
    auVar103._8_8_ = auVar103._0_8_;
    auVar103._16_8_ = auVar103._0_8_;
    auVar103._24_8_ = auVar103._0_8_;
    auVar72 = vsubps_avx(auVar103,auVar211);
    uVar64 = auVar65._0_4_;
    auVar283._4_4_ = uVar64;
    auVar283._0_4_ = uVar64;
    auVar283._8_4_ = uVar64;
    auVar283._12_4_ = uVar64;
    auVar283._16_4_ = uVar64;
    auVar283._20_4_ = uVar64;
    auVar283._24_4_ = uVar64;
    auVar283._28_4_ = uVar64;
    auVar7 = vmovshdup_avx(auVar65);
    uVar155 = auVar7._0_8_;
    auVar266._8_8_ = uVar155;
    auVar266._0_8_ = uVar155;
    auVar266._16_8_ = uVar155;
    auVar266._24_8_ = uVar155;
    fVar74 = auVar92._0_4_;
    auVar89._4_4_ = fVar74;
    auVar89._0_4_ = fVar74;
    auVar89._8_4_ = fVar74;
    auVar89._12_4_ = fVar74;
    auVar89._16_4_ = fVar74;
    auVar89._20_4_ = fVar74;
    auVar89._24_4_ = fVar74;
    auVar89._28_4_ = fVar74;
    auVar70 = vmovshdup_avx(auVar92);
    auVar170._0_8_ = auVar70._0_8_;
    auVar170._8_8_ = auVar170._0_8_;
    auVar170._16_8_ = auVar170._0_8_;
    auVar170._24_8_ = auVar170._0_8_;
    fVar152 = auVar76._0_4_;
    auVar243._4_4_ = fVar152;
    auVar243._0_4_ = fVar152;
    auVar243._8_4_ = fVar152;
    auVar243._12_4_ = fVar152;
    auVar243._16_4_ = fVar152;
    auVar243._20_4_ = fVar152;
    auVar243._24_4_ = fVar152;
    auVar243._28_4_ = fVar152;
    auVar273 = vmovshdup_avx(auVar76);
    auVar220._0_8_ = auVar273._0_8_;
    auVar220._8_8_ = auVar220._0_8_;
    auVar220._16_8_ = auVar220._0_8_;
    auVar220._24_8_ = auVar220._0_8_;
    local_598 = auVar201._0_4_;
    auVar66 = vmovshdup_avx(auVar201);
    auVar77 = vfmadd132ps_fma(auVar72,auVar211,_DAT_02020f20);
    auVar72 = vsubps_avx(auVar114,ZEXT1632(auVar77));
    fVar133 = auVar77._0_4_;
    auVar275._0_4_ = fVar74 * fVar133;
    fVar149 = auVar77._4_4_;
    auVar275._4_4_ = fVar74 * fVar149;
    fVar150 = auVar77._8_4_;
    auVar275._8_4_ = fVar74 * fVar150;
    fVar151 = auVar77._12_4_;
    auVar275._12_4_ = fVar74 * fVar151;
    auVar275._16_4_ = fVar74 * 0.0;
    auVar275._20_4_ = fVar74 * 0.0;
    auVar275._24_4_ = fVar74 * 0.0;
    auVar275._28_4_ = 0;
    auVar77 = vfmadd231ps_fma(auVar275,auVar72,auVar283);
    fVar134 = auVar70._0_4_;
    auVar252._0_4_ = fVar134 * fVar133;
    fVar117 = auVar70._4_4_;
    auVar252._4_4_ = fVar117 * fVar149;
    auVar252._8_4_ = fVar134 * fVar150;
    auVar252._12_4_ = fVar117 * fVar151;
    auVar252._16_4_ = fVar134 * 0.0;
    auVar252._20_4_ = fVar117 * 0.0;
    auVar252._24_4_ = fVar134 * 0.0;
    auVar252._28_4_ = 0;
    auVar106 = vfmadd231ps_fma(auVar252,auVar72,auVar266);
    auVar11._4_4_ = fVar152 * fVar149;
    auVar11._0_4_ = fVar152 * fVar133;
    auVar11._8_4_ = fVar152 * fVar150;
    auVar11._12_4_ = fVar152 * fVar151;
    auVar11._16_4_ = fVar152 * 0.0;
    auVar11._20_4_ = fVar152 * 0.0;
    auVar11._24_4_ = fVar152 * 0.0;
    auVar11._28_4_ = auVar7._4_4_;
    auVar119 = vfmadd231ps_fma(auVar11,auVar72,auVar89);
    fVar134 = auVar273._0_4_;
    fVar117 = auVar273._4_4_;
    auVar12._4_4_ = fVar117 * fVar149;
    auVar12._0_4_ = fVar134 * fVar133;
    auVar12._8_4_ = fVar134 * fVar150;
    auVar12._12_4_ = fVar117 * fVar151;
    auVar12._16_4_ = fVar134 * 0.0;
    auVar12._20_4_ = fVar117 * 0.0;
    auVar12._24_4_ = fVar134 * 0.0;
    auVar12._28_4_ = uVar64;
    auVar123 = vfmadd231ps_fma(auVar12,auVar72,auVar170);
    auVar7 = vshufps_avx(auVar65,auVar65,0xaa);
    auVar171._0_8_ = auVar7._0_8_;
    auVar171._8_8_ = auVar171._0_8_;
    auVar171._16_8_ = auVar171._0_8_;
    auVar171._24_8_ = auVar171._0_8_;
    auVar70 = vshufps_avx(auVar65,auVar65,0xff);
    uStack_5f0 = auVar70._0_8_;
    local_5f8 = (undefined1  [8])uStack_5f0;
    uStack_5e8 = uStack_5f0;
    uStack_5e0 = uStack_5f0;
    auVar13._4_4_ = fVar149 * local_598;
    auVar13._0_4_ = fVar133 * local_598;
    auVar13._8_4_ = fVar150 * local_598;
    auVar13._12_4_ = fVar151 * local_598;
    auVar13._16_4_ = local_598 * 0.0;
    auVar13._20_4_ = local_598 * 0.0;
    auVar13._24_4_ = local_598 * 0.0;
    auVar13._28_4_ = 0x3f800000;
    auVar75 = vfmadd231ps_fma(auVar13,auVar72,auVar243);
    auVar273 = vshufps_avx(auVar92,auVar92,0xaa);
    auVar131._0_8_ = auVar273._0_8_;
    auVar131._8_8_ = auVar131._0_8_;
    auVar131._16_8_ = auVar131._0_8_;
    auVar131._24_8_ = auVar131._0_8_;
    auVar65 = vshufps_avx(auVar92,auVar92,0xff);
    auVar148._0_8_ = auVar65._0_8_;
    auVar148._8_8_ = auVar148._0_8_;
    auVar148._16_8_ = auVar148._0_8_;
    auVar148._24_8_ = auVar148._0_8_;
    fVar134 = auVar66._0_4_;
    fVar117 = auVar66._4_4_;
    auVar14._4_4_ = fVar117 * fVar149;
    auVar14._0_4_ = fVar134 * fVar133;
    auVar14._8_4_ = fVar134 * fVar150;
    auVar14._12_4_ = fVar117 * fVar151;
    auVar14._16_4_ = fVar134 * 0.0;
    auVar14._20_4_ = fVar117 * 0.0;
    auVar14._24_4_ = fVar134 * 0.0;
    auVar14._28_4_ = fVar152;
    auVar118 = vfmadd231ps_fma(auVar14,auVar72,auVar220);
    auVar15._28_4_ = fVar74;
    auVar15._0_28_ =
         ZEXT1628(CONCAT412(auVar119._12_4_ * fVar151,
                            CONCAT48(auVar119._8_4_ * fVar150,
                                     CONCAT44(auVar119._4_4_ * fVar149,auVar119._0_4_ * fVar133))));
    auVar77 = vfmadd231ps_fma(auVar15,auVar72,ZEXT1632(auVar77));
    auVar16._28_4_ = auVar70._4_4_;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar123._12_4_ * fVar151,
                            CONCAT48(auVar123._8_4_ * fVar150,
                                     CONCAT44(auVar123._4_4_ * fVar149,auVar123._0_4_ * fVar133))));
    auVar106 = vfmadd231ps_fma(auVar16,auVar72,ZEXT1632(auVar106));
    auVar70 = vshufps_avx(auVar76,auVar76,0xaa);
    uVar155 = auVar70._0_8_;
    auVar253._8_8_ = uVar155;
    auVar253._0_8_ = uVar155;
    auVar253._16_8_ = uVar155;
    auVar253._24_8_ = uVar155;
    auVar66 = vshufps_avx(auVar76,auVar76,0xff);
    uVar155 = auVar66._0_8_;
    auVar276._8_8_ = uVar155;
    auVar276._0_8_ = uVar155;
    auVar276._16_8_ = uVar155;
    auVar276._24_8_ = uVar155;
    auVar119 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar75._12_4_,
                                                  CONCAT48(fVar150 * auVar75._8_4_,
                                                           CONCAT44(fVar149 * auVar75._4_4_,
                                                                    fVar133 * auVar75._0_4_)))),
                               auVar72,ZEXT1632(auVar119));
    auVar92 = vshufps_avx(auVar201,auVar201,0xaa);
    auVar76 = vshufps_avx(auVar201,auVar201,0xff);
    local_598 = auVar76._0_4_;
    fStack_594 = auVar76._4_4_;
    auVar17._28_4_ = fStack_594;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar118._12_4_ * fVar151,
                            CONCAT48(auVar118._8_4_ * fVar150,
                                     CONCAT44(auVar118._4_4_ * fVar149,auVar118._0_4_ * fVar133))));
    auVar76 = vfmadd231ps_fma(auVar17,auVar72,ZEXT1632(auVar123));
    auVar201 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar119._12_4_,
                                                  CONCAT48(fVar150 * auVar119._8_4_,
                                                           CONCAT44(fVar149 * auVar119._4_4_,
                                                                    fVar133 * auVar119._0_4_)))),
                               auVar72,ZEXT1632(auVar77));
    auVar11 = vsubps_avx(ZEXT1632(auVar119),ZEXT1632(auVar77));
    auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar76._12_4_,
                                                 CONCAT48(fVar150 * auVar76._8_4_,
                                                          CONCAT44(fVar149 * auVar76._4_4_,
                                                                   fVar133 * auVar76._0_4_)))),
                              auVar72,ZEXT1632(auVar106));
    auVar12 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar106));
    fVar255 = fVar91 * auVar11._0_4_ * 3.0;
    fVar257 = fVar91 * auVar11._4_4_ * 3.0;
    auVar254._4_4_ = fVar257;
    auVar254._0_4_ = fVar255;
    fVar230 = fVar91 * auVar11._8_4_ * 3.0;
    auVar254._8_4_ = fVar230;
    fVar231 = fVar91 * auVar11._12_4_ * 3.0;
    auVar254._12_4_ = fVar231;
    fVar232 = fVar91 * auVar11._16_4_ * 3.0;
    auVar254._16_4_ = fVar232;
    fVar233 = fVar91 * auVar11._20_4_ * 3.0;
    auVar254._20_4_ = fVar233;
    fVar234 = fVar91 * auVar11._24_4_ * 3.0;
    auVar254._24_4_ = fVar234;
    auVar254._28_4_ = 0x40400000;
    local_5c8._0_4_ = fVar91 * auVar12._0_4_ * 3.0;
    local_5c8._4_4_ = fVar91 * auVar12._4_4_ * 3.0;
    fStack_5c0 = fVar91 * auVar12._8_4_ * 3.0;
    fStack_5bc = fVar91 * auVar12._12_4_ * 3.0;
    fStack_5b8 = fVar91 * auVar12._16_4_ * 3.0;
    fStack_5b4 = fVar91 * auVar12._20_4_ * 3.0;
    fStack_5b0 = fVar91 * auVar12._24_4_ * 3.0;
    fStack_5ac = auVar12._28_4_;
    fVar74 = auVar273._0_4_;
    fVar134 = auVar273._4_4_;
    auVar18._4_4_ = fVar134 * fVar149;
    auVar18._0_4_ = fVar74 * fVar133;
    auVar18._8_4_ = fVar74 * fVar150;
    auVar18._12_4_ = fVar134 * fVar151;
    auVar18._16_4_ = fVar74 * 0.0;
    auVar18._20_4_ = fVar134 * 0.0;
    auVar18._24_4_ = fVar74 * 0.0;
    auVar18._28_4_ = auVar11._28_4_;
    auVar273 = vfmadd231ps_fma(auVar18,auVar72,auVar171);
    fVar74 = auVar65._0_4_;
    fVar117 = auVar65._4_4_;
    auVar19._4_4_ = fVar117 * fVar149;
    auVar19._0_4_ = fVar74 * fVar133;
    auVar19._8_4_ = fVar74 * fVar150;
    auVar19._12_4_ = fVar117 * fVar151;
    auVar19._16_4_ = fVar74 * 0.0;
    auVar19._20_4_ = fVar117 * 0.0;
    auVar19._24_4_ = fVar74 * 0.0;
    auVar19._28_4_ = auVar7._4_4_;
    auVar7 = vfmadd231ps_fma(auVar19,auVar72,_local_5f8);
    fVar74 = auVar70._0_4_;
    fVar117 = auVar70._4_4_;
    auVar20._4_4_ = fVar117 * fVar149;
    auVar20._0_4_ = fVar74 * fVar133;
    auVar20._8_4_ = fVar74 * fVar150;
    auVar20._12_4_ = fVar117 * fVar151;
    auVar20._16_4_ = fVar74 * 0.0;
    auVar20._20_4_ = fVar117 * 0.0;
    auVar20._24_4_ = fVar74 * 0.0;
    auVar20._28_4_ = fVar91;
    auVar70 = vfmadd231ps_fma(auVar20,auVar72,auVar131);
    fVar74 = auVar66._0_4_;
    fVar152 = auVar66._4_4_;
    auVar21._4_4_ = fVar152 * fVar149;
    auVar21._0_4_ = fVar74 * fVar133;
    auVar21._8_4_ = fVar74 * fVar150;
    auVar21._12_4_ = fVar152 * fVar151;
    auVar21._16_4_ = fVar74 * 0.0;
    auVar21._20_4_ = fVar152 * 0.0;
    auVar21._24_4_ = fVar74 * 0.0;
    auVar21._28_4_ = fVar134;
    auVar66 = vfmadd231ps_fma(auVar21,auVar72,auVar148);
    local_2a8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar201));
    fVar74 = auVar92._0_4_;
    fVar134 = auVar92._4_4_;
    auVar22._4_4_ = fVar134 * fVar149;
    auVar22._0_4_ = fVar74 * fVar133;
    auVar22._8_4_ = fVar74 * fVar150;
    auVar22._12_4_ = fVar134 * fVar151;
    auVar22._16_4_ = fVar74 * 0.0;
    auVar22._20_4_ = fVar134 * 0.0;
    auVar22._24_4_ = fVar74 * 0.0;
    auVar22._28_4_ = local_2a8._28_4_;
    auVar65 = vfmadd231ps_fma(auVar22,auVar72,auVar253);
    auVar15 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar77));
    auVar23._4_4_ = fVar149 * fStack_594;
    auVar23._0_4_ = fVar133 * local_598;
    auVar23._8_4_ = fVar150 * local_598;
    auVar23._12_4_ = fVar151 * fStack_594;
    auVar23._16_4_ = local_598 * 0.0;
    auVar23._20_4_ = fStack_594 * 0.0;
    auVar23._24_4_ = local_598 * 0.0;
    auVar23._28_4_ = fVar117;
    auVar92 = vfmadd231ps_fma(auVar23,auVar72,auVar276);
    auVar24._28_4_ = fVar134;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar151 * auVar70._12_4_,
                            CONCAT48(fVar150 * auVar70._8_4_,
                                     CONCAT44(fVar149 * auVar70._4_4_,fVar133 * auVar70._0_4_))));
    auVar273 = vfmadd231ps_fma(auVar24,auVar72,ZEXT1632(auVar273));
    auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar66._12_4_,
                                                CONCAT48(fVar150 * auVar66._8_4_,
                                                         CONCAT44(fVar149 * auVar66._4_4_,
                                                                  fVar133 * auVar66._0_4_)))),
                             auVar72,ZEXT1632(auVar7));
    fVar255 = auVar201._0_4_ + fVar255;
    fVar257 = auVar201._4_4_ + fVar257;
    fVar230 = auVar201._8_4_ + fVar230;
    fVar231 = auVar201._12_4_ + fVar231;
    fVar232 = fVar232 + 0.0;
    fVar233 = fVar233 + 0.0;
    fVar234 = fVar234 + 0.0;
    auVar25._28_4_ = 0x40400000;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(auVar92._12_4_ * fVar151,
                            CONCAT48(auVar92._8_4_ * fVar150,
                                     CONCAT44(auVar92._4_4_ * fVar149,auVar92._0_4_ * fVar133))));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar65._12_4_,
                                                 CONCAT48(fVar150 * auVar65._8_4_,
                                                          CONCAT44(fVar149 * auVar65._4_4_,
                                                                   fVar133 * auVar65._0_4_)))),
                              auVar72,ZEXT1632(auVar70));
    auVar66 = vfmadd231ps_fma(auVar25,auVar72,ZEXT1632(auVar66));
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar70._12_4_,
                                                 CONCAT48(fVar150 * auVar70._8_4_,
                                                          CONCAT44(fVar149 * auVar70._4_4_,
                                                                   fVar133 * auVar70._0_4_)))),
                              auVar72,ZEXT1632(auVar273));
    auVar92 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar151 * auVar66._12_4_,
                                                 CONCAT48(fVar150 * auVar66._8_4_,
                                                          CONCAT44(fVar149 * auVar66._4_4_,
                                                                   fVar133 * auVar66._0_4_)))),
                              ZEXT1632(auVar7),auVar72);
    auVar72 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar273));
    auVar11 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar7));
    fVar133 = fVar91 * auVar72._0_4_ * 3.0;
    fVar149 = fVar91 * auVar72._4_4_ * 3.0;
    auVar26._4_4_ = fVar149;
    auVar26._0_4_ = fVar133;
    fVar150 = fVar91 * auVar72._8_4_ * 3.0;
    auVar26._8_4_ = fVar150;
    fVar151 = fVar91 * auVar72._12_4_ * 3.0;
    auVar26._12_4_ = fVar151;
    fVar152 = fVar91 * auVar72._16_4_ * 3.0;
    auVar26._16_4_ = fVar152;
    fVar153 = fVar91 * auVar72._20_4_ * 3.0;
    auVar26._20_4_ = fVar153;
    fVar244 = fVar91 * auVar72._24_4_ * 3.0;
    auVar26._24_4_ = fVar244;
    auVar26._28_4_ = 0x40400000;
    auVar194._0_4_ = fVar91 * auVar11._0_4_ * 3.0;
    auVar194._4_4_ = fVar91 * auVar11._4_4_ * 3.0;
    auVar194._8_4_ = fVar91 * auVar11._8_4_ * 3.0;
    auVar194._12_4_ = fVar91 * auVar11._12_4_ * 3.0;
    auVar194._16_4_ = fVar91 * auVar11._16_4_ * 3.0;
    auVar194._20_4_ = fVar91 * auVar11._20_4_ * 3.0;
    auVar194._24_4_ = fVar91 * auVar11._24_4_ * 3.0;
    auVar194._28_4_ = 0;
    auVar16 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar65));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar92));
    auVar72 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar201));
    auVar11 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar77));
    auVar13 = vsubps_avx(auVar16,local_2a8);
    fVar256 = auVar72._0_4_ + auVar13._0_4_;
    fVar174 = auVar72._4_4_ + auVar13._4_4_;
    fVar176 = auVar72._8_4_ + auVar13._8_4_;
    fVar178 = auVar72._12_4_ + auVar13._12_4_;
    fVar179 = auVar72._16_4_ + auVar13._16_4_;
    fVar180 = auVar72._20_4_ + auVar13._20_4_;
    fVar181 = auVar72._24_4_ + auVar13._24_4_;
    auVar14 = vsubps_avx(local_78,auVar15);
    auVar267._0_4_ = auVar11._0_4_ + auVar14._0_4_;
    auVar267._4_4_ = auVar11._4_4_ + auVar14._4_4_;
    auVar267._8_4_ = auVar11._8_4_ + auVar14._8_4_;
    auVar267._12_4_ = auVar11._12_4_ + auVar14._12_4_;
    auVar267._16_4_ = auVar11._16_4_ + auVar14._16_4_;
    auVar267._20_4_ = auVar11._20_4_ + auVar14._20_4_;
    auVar267._24_4_ = auVar11._24_4_ + auVar14._24_4_;
    auVar267._28_4_ = auVar11._28_4_ + auVar14._28_4_;
    fVar91 = auVar77._0_4_;
    local_158 = fVar91 + (float)local_5c8._0_4_;
    fVar74 = auVar77._4_4_;
    fStack_154 = fVar74 + (float)local_5c8._4_4_;
    fVar134 = auVar77._8_4_;
    fStack_150 = fVar134 + fStack_5c0;
    fVar117 = auVar77._12_4_;
    fStack_14c = fVar117 + fStack_5bc;
    fStack_148 = fStack_5b8 + 0.0;
    fStack_144 = fStack_5b4 + 0.0;
    fStack_140 = fStack_5b0 + 0.0;
    fStack_13c = auVar12._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar201);
    auVar11 = vsubps_avx(local_98,auVar254);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar11);
    local_b8 = ZEXT1632(auVar77);
    auVar11 = vsubps_avx(local_b8,_local_5c8);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar11);
    local_f8._0_4_ = auVar65._0_4_ + fVar133;
    local_f8._4_4_ = auVar65._4_4_ + fVar149;
    local_f8._8_4_ = auVar65._8_4_ + fVar150;
    local_f8._12_4_ = auVar65._12_4_ + fVar151;
    local_f8._16_4_ = fVar152 + 0.0;
    local_f8._20_4_ = fVar153 + 0.0;
    local_f8._24_4_ = fVar244 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar254 = ZEXT1632(auVar65);
    auVar11 = vsubps_avx(auVar254,auVar26);
    auVar17 = vpermps_avx2(_DAT_0205d4a0,auVar11);
    fVar133 = auVar92._0_4_;
    local_138._0_4_ = fVar133 + auVar194._0_4_;
    fVar149 = auVar92._4_4_;
    local_138._4_4_ = fVar149 + auVar194._4_4_;
    fVar150 = auVar92._8_4_;
    local_138._8_4_ = fVar150 + auVar194._8_4_;
    fVar151 = auVar92._12_4_;
    local_138._12_4_ = fVar151 + auVar194._12_4_;
    local_138._16_4_ = auVar194._16_4_ + 0.0;
    local_138._20_4_ = auVar194._20_4_ + 0.0;
    local_138._24_4_ = auVar194._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar11 = vsubps_avx(ZEXT1632(auVar92),auVar194);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar11);
    auVar27._4_4_ = fVar74 * fVar174;
    auVar27._0_4_ = fVar91 * fVar256;
    auVar27._8_4_ = fVar134 * fVar176;
    auVar27._12_4_ = fVar117 * fVar178;
    auVar27._16_4_ = fVar179 * 0.0;
    auVar27._20_4_ = fVar180 * 0.0;
    auVar27._24_4_ = fVar181 * 0.0;
    auVar27._28_4_ = auVar11._28_4_;
    auVar7 = vfnmadd231ps_fma(auVar27,local_98,auVar267);
    auVar28._4_4_ = fStack_154 * fVar174;
    auVar28._0_4_ = local_158 * fVar256;
    auVar28._8_4_ = fStack_150 * fVar176;
    auVar28._12_4_ = fStack_14c * fVar178;
    auVar28._16_4_ = fStack_148 * fVar179;
    auVar28._20_4_ = fStack_144 * fVar180;
    auVar28._24_4_ = fStack_140 * fVar181;
    auVar28._28_4_ = auVar17._28_4_;
    auVar41._4_4_ = fVar257;
    auVar41._0_4_ = fVar255;
    auVar41._8_4_ = fVar230;
    auVar41._12_4_ = fVar231;
    auVar41._16_4_ = fVar232;
    auVar41._20_4_ = fVar233;
    auVar41._24_4_ = fVar234;
    auVar41._28_4_ = 0x40400000;
    auVar70 = vfnmadd231ps_fma(auVar28,auVar267,auVar41);
    auVar29._4_4_ = local_178._4_4_ * fVar174;
    auVar29._0_4_ = local_178._0_4_ * fVar256;
    auVar29._8_4_ = local_178._8_4_ * fVar176;
    auVar29._12_4_ = local_178._12_4_ * fVar178;
    auVar29._16_4_ = local_178._16_4_ * fVar179;
    auVar29._20_4_ = local_178._20_4_ * fVar180;
    auVar29._24_4_ = local_178._24_4_ * fVar181;
    auVar29._28_4_ = fStack_13c;
    auVar273 = vfnmadd231ps_fma(auVar29,local_d8,auVar267);
    local_5f8._0_4_ = auVar15._0_4_;
    local_5f8._4_4_ = auVar15._4_4_;
    uStack_5f0._0_4_ = auVar15._8_4_;
    uStack_5f0._4_4_ = auVar15._12_4_;
    uStack_5e8._0_4_ = auVar15._16_4_;
    uStack_5e8._4_4_ = auVar15._20_4_;
    uStack_5e0._0_4_ = auVar15._24_4_;
    auVar30._4_4_ = fVar174 * (float)local_5f8._4_4_;
    auVar30._0_4_ = fVar256 * (float)local_5f8._0_4_;
    auVar30._8_4_ = fVar176 * (float)uStack_5f0;
    auVar30._12_4_ = fVar178 * uStack_5f0._4_4_;
    auVar30._16_4_ = fVar179 * (float)uStack_5e8;
    auVar30._20_4_ = fVar180 * uStack_5e8._4_4_;
    auVar30._24_4_ = fVar181 * (float)uStack_5e0;
    auVar30._28_4_ = local_178._28_4_;
    auVar66 = vfnmadd231ps_fma(auVar30,local_2a8,auVar267);
    auVar49._4_4_ = fVar149 * fVar174;
    auVar49._0_4_ = fVar133 * fVar256;
    auVar49._8_4_ = fVar150 * fVar176;
    auVar49._12_4_ = fVar151 * fVar178;
    auVar49._16_4_ = fVar179 * 0.0;
    auVar49._20_4_ = fVar180 * 0.0;
    auVar49._24_4_ = fVar181 * 0.0;
    auVar49._28_4_ = DAT_0205d4a0._28_4_;
    auVar65 = vfnmadd231ps_fma(auVar49,auVar254,auVar267);
    auVar31._4_4_ = local_138._4_4_ * fVar174;
    auVar31._0_4_ = local_138._0_4_ * fVar256;
    auVar31._8_4_ = local_138._8_4_ * fVar176;
    auVar31._12_4_ = local_138._12_4_ * fVar178;
    auVar31._16_4_ = local_138._16_4_ * fVar179;
    auVar31._20_4_ = local_138._20_4_ * fVar180;
    auVar31._24_4_ = local_138._24_4_ * fVar181;
    auVar31._28_4_ = local_2a8._28_4_;
    auVar76 = vfnmadd231ps_fma(auVar31,local_f8,auVar267);
    auVar32._4_4_ = local_118._4_4_ * fVar174;
    auVar32._0_4_ = local_118._0_4_ * fVar256;
    auVar32._8_4_ = local_118._8_4_ * fVar176;
    auVar32._12_4_ = local_118._12_4_ * fVar178;
    auVar32._16_4_ = local_118._16_4_ * fVar179;
    auVar32._20_4_ = local_118._20_4_ * fVar180;
    auVar32._24_4_ = local_118._24_4_ * fVar181;
    auVar32._28_4_ = local_d8._28_4_;
    auVar201 = vfnmadd231ps_fma(auVar32,auVar267,auVar17);
    auVar33._4_4_ = local_78._4_4_ * fVar174;
    auVar33._0_4_ = local_78._0_4_ * fVar256;
    auVar33._8_4_ = local_78._8_4_ * fVar176;
    auVar33._12_4_ = local_78._12_4_ * fVar178;
    auVar33._16_4_ = local_78._16_4_ * fVar179;
    auVar33._20_4_ = local_78._20_4_ * fVar180;
    auVar33._24_4_ = local_78._24_4_ * fVar181;
    auVar33._28_4_ = auVar72._28_4_ + auVar13._28_4_;
    auVar77 = vfnmadd231ps_fma(auVar33,auVar267,auVar16);
    auVar11 = vminps_avx(ZEXT1632(auVar7),ZEXT1632(auVar70));
    auVar72 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar70));
    auVar12 = vminps_avx(ZEXT1632(auVar273),ZEXT1632(auVar66));
    auVar12 = vminps_avx(auVar11,auVar12);
    auVar11 = vmaxps_avx(ZEXT1632(auVar273),ZEXT1632(auVar66));
    auVar72 = vmaxps_avx(auVar72,auVar11);
    auVar13 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar76));
    auVar11 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar76));
    auVar14 = vminps_avx(ZEXT1632(auVar201),ZEXT1632(auVar77));
    auVar13 = vminps_avx(auVar13,auVar14);
    auVar13 = vminps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(ZEXT1632(auVar201),ZEXT1632(auVar77));
    auVar11 = vmaxps_avx(auVar11,auVar12);
    auVar11 = vmaxps_avx(auVar72,auVar11);
    auVar48._4_4_ = fStack_194;
    auVar48._0_4_ = local_198;
    auVar48._8_4_ = fStack_190;
    auVar48._12_4_ = fStack_18c;
    auVar48._16_4_ = fStack_188;
    auVar48._20_4_ = fStack_184;
    auVar48._24_4_ = fStack_180;
    auVar48._28_4_ = fStack_17c;
    auVar72 = vcmpps_avx(auVar13,auVar48,2);
    auVar47._4_4_ = fStack_1b4;
    auVar47._0_4_ = local_1b8;
    auVar47._8_4_ = fStack_1b0;
    auVar47._12_4_ = fStack_1ac;
    auVar47._16_4_ = fStack_1a8;
    auVar47._20_4_ = fStack_1a4;
    auVar47._24_4_ = fStack_1a0;
    auVar47._28_4_ = fStack_19c;
    auVar11 = vcmpps_avx(auVar11,auVar47,5);
    auVar72 = vandps_avx(auVar11,auVar72);
    auVar11 = local_288 & auVar72;
    uVar51 = 0;
    if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0x7f,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar11 >> 0xbf,0) != '\0') ||
        (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar11[0x1f] < '\0')
    {
      auVar11 = vsubps_avx(local_2a8,local_98);
      auVar12 = vsubps_avx(auVar16,auVar254);
      fVar153 = auVar11._0_4_ + auVar12._0_4_;
      fVar244 = auVar11._4_4_ + auVar12._4_4_;
      fVar256 = auVar11._8_4_ + auVar12._8_4_;
      fVar174 = auVar11._12_4_ + auVar12._12_4_;
      fVar176 = auVar11._16_4_ + auVar12._16_4_;
      fVar178 = auVar11._20_4_ + auVar12._20_4_;
      fVar179 = auVar11._24_4_ + auVar12._24_4_;
      auVar13 = vsubps_avx(auVar15,local_b8);
      auVar14 = vsubps_avx(local_78,ZEXT1632(auVar92));
      auVar90._0_4_ = auVar13._0_4_ + auVar14._0_4_;
      auVar90._4_4_ = auVar13._4_4_ + auVar14._4_4_;
      auVar90._8_4_ = auVar13._8_4_ + auVar14._8_4_;
      auVar90._12_4_ = auVar13._12_4_ + auVar14._12_4_;
      auVar90._16_4_ = auVar13._16_4_ + auVar14._16_4_;
      auVar90._20_4_ = auVar13._20_4_ + auVar14._20_4_;
      auVar90._24_4_ = auVar13._24_4_ + auVar14._24_4_;
      fVar152 = auVar14._28_4_;
      auVar90._28_4_ = auVar13._28_4_ + fVar152;
      auVar277._0_4_ = fVar91 * fVar153;
      auVar277._4_4_ = fVar74 * fVar244;
      auVar277._8_4_ = fVar134 * fVar256;
      auVar277._12_4_ = fVar117 * fVar174;
      auVar277._16_4_ = fVar176 * 0.0;
      auVar277._20_4_ = fVar178 * 0.0;
      auVar277._24_4_ = fVar179 * 0.0;
      auVar277._28_4_ = 0;
      auVar65 = vfnmadd231ps_fma(auVar277,auVar90,local_98);
      auVar34._4_4_ = fVar244 * fStack_154;
      auVar34._0_4_ = fVar153 * local_158;
      auVar34._8_4_ = fVar256 * fStack_150;
      auVar34._12_4_ = fVar174 * fStack_14c;
      auVar34._16_4_ = fVar176 * fStack_148;
      auVar34._20_4_ = fVar178 * fStack_144;
      auVar34._24_4_ = fVar179 * fStack_140;
      auVar34._28_4_ = fVar152;
      auVar42._4_4_ = fVar257;
      auVar42._0_4_ = fVar255;
      auVar42._8_4_ = fVar230;
      auVar42._12_4_ = fVar231;
      auVar42._16_4_ = fVar232;
      auVar42._20_4_ = fVar233;
      auVar42._24_4_ = fVar234;
      auVar42._28_4_ = 0x40400000;
      auVar7 = vfnmadd213ps_fma(auVar42,auVar90,auVar34);
      auVar35._4_4_ = fVar244 * local_178._4_4_;
      auVar35._0_4_ = fVar153 * local_178._0_4_;
      auVar35._8_4_ = fVar256 * local_178._8_4_;
      auVar35._12_4_ = fVar174 * local_178._12_4_;
      auVar35._16_4_ = fVar176 * local_178._16_4_;
      auVar35._20_4_ = fVar178 * local_178._20_4_;
      auVar35._24_4_ = fVar179 * local_178._24_4_;
      auVar35._28_4_ = fVar152;
      auVar70 = vfnmadd213ps_fma(local_d8,auVar90,auVar35);
      auVar36._4_4_ = (float)local_5f8._4_4_ * fVar244;
      auVar36._0_4_ = (float)local_5f8._0_4_ * fVar153;
      auVar36._8_4_ = (float)uStack_5f0 * fVar256;
      auVar36._12_4_ = uStack_5f0._4_4_ * fVar174;
      auVar36._16_4_ = (float)uStack_5e8 * fVar176;
      auVar36._20_4_ = uStack_5e8._4_4_ * fVar178;
      auVar36._24_4_ = (float)uStack_5e0 * fVar179;
      auVar36._28_4_ = fVar152;
      auVar92 = vfnmadd231ps_fma(auVar36,auVar90,local_2a8);
      auVar104._0_4_ = fVar133 * fVar153;
      auVar104._4_4_ = fVar149 * fVar244;
      auVar104._8_4_ = fVar150 * fVar256;
      auVar104._12_4_ = fVar151 * fVar174;
      auVar104._16_4_ = fVar176 * 0.0;
      auVar104._20_4_ = fVar178 * 0.0;
      auVar104._24_4_ = fVar179 * 0.0;
      auVar104._28_4_ = 0;
      auVar76 = vfnmadd231ps_fma(auVar104,auVar90,auVar254);
      auVar37._4_4_ = fVar244 * local_138._4_4_;
      auVar37._0_4_ = fVar153 * local_138._0_4_;
      auVar37._8_4_ = fVar256 * local_138._8_4_;
      auVar37._12_4_ = fVar174 * local_138._12_4_;
      auVar37._16_4_ = fVar176 * local_138._16_4_;
      auVar37._20_4_ = fVar178 * local_138._20_4_;
      auVar37._24_4_ = fVar179 * local_138._24_4_;
      auVar37._28_4_ = auVar15._28_4_;
      auVar273 = vfnmadd213ps_fma(local_f8,auVar90,auVar37);
      auVar38._4_4_ = fVar244 * local_118._4_4_;
      auVar38._0_4_ = fVar153 * local_118._0_4_;
      auVar38._8_4_ = fVar256 * local_118._8_4_;
      auVar38._12_4_ = fVar174 * local_118._12_4_;
      auVar38._16_4_ = fVar176 * local_118._16_4_;
      auVar38._20_4_ = fVar178 * local_118._20_4_;
      auVar38._24_4_ = fVar179 * local_118._24_4_;
      auVar38._28_4_ = auVar15._28_4_;
      auVar66 = vfnmadd213ps_fma(auVar17,auVar90,auVar38);
      auVar39._4_4_ = local_78._4_4_ * fVar244;
      auVar39._0_4_ = local_78._0_4_ * fVar153;
      auVar39._8_4_ = local_78._8_4_ * fVar256;
      auVar39._12_4_ = local_78._12_4_ * fVar174;
      auVar39._16_4_ = local_78._16_4_ * fVar176;
      auVar39._20_4_ = local_78._20_4_ * fVar178;
      auVar39._24_4_ = local_78._24_4_ * fVar179;
      auVar39._28_4_ = auVar11._28_4_ + auVar12._28_4_;
      auVar201 = vfnmadd231ps_fma(auVar39,auVar90,auVar16);
      auVar12 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar7));
      auVar11 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar7));
      auVar13 = vminps_avx(ZEXT1632(auVar70),ZEXT1632(auVar92));
      auVar13 = vminps_avx(auVar12,auVar13);
      auVar12 = vmaxps_avx(ZEXT1632(auVar70),ZEXT1632(auVar92));
      auVar11 = vmaxps_avx(auVar11,auVar12);
      auVar14 = vminps_avx(ZEXT1632(auVar76),ZEXT1632(auVar273));
      auVar12 = vmaxps_avx(ZEXT1632(auVar76),ZEXT1632(auVar273));
      auVar15 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar201));
      auVar14 = vminps_avx(auVar14,auVar15);
      auVar14 = vminps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar201));
      auVar12 = vmaxps_avx(auVar12,auVar13);
      auVar12 = vmaxps_avx(auVar11,auVar12);
      auVar11 = vcmpps_avx(auVar14,auVar48,2);
      auVar12 = vcmpps_avx(auVar12,auVar47,5);
      auVar11 = vandps_avx(auVar12,auVar11);
      auVar72 = vandps_avx(auVar72,local_288);
      auVar12 = auVar72 & auVar11;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar72 = vandps_avx(auVar11,auVar72);
        uVar51 = vmovmskps_avx(auVar72);
      }
    }
    if (uVar51 != 0) {
      auStack_408[uVar54] = uVar51;
      uVar155 = vmovlps_avx(local_358);
      *(undefined8 *)(&uStack_268 + uVar54 * 2) = uVar155;
      uVar59 = vmovlps_avx(auVar135);
      auStack_58[uVar54] = uVar59;
      uVar54 = (ulong)((int)uVar54 + 1);
    }
    do {
      if ((int)uVar54 == 0) {
        if (bVar60) {
          return local_669;
        }
        uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar71._4_4_ = uVar64;
        auVar71._0_4_ = uVar64;
        auVar71._8_4_ = uVar64;
        auVar71._12_4_ = uVar64;
        auVar7 = vcmpps_avx(local_368,auVar71,2);
        uVar50 = vmovmskps_avx(auVar7);
        uVar50 = (uint)uVar61 & uVar50;
        local_669 = uVar50 != 0;
        if (!local_669) {
          return local_669;
        }
        goto LAB_01657004;
      }
      uVar52 = (int)uVar54 - 1;
      uVar55 = (ulong)uVar52;
      uVar58 = auStack_408[uVar55];
      uVar51 = (&uStack_268)[uVar55 * 2];
      fVar133 = afStack_264[uVar55 * 2];
      iVar53 = 0;
      for (uVar59 = (ulong)uVar58; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
        iVar53 = iVar53 + 1;
      }
      uVar58 = uVar58 - 1 & uVar58;
      if (uVar58 == 0) {
        uVar54 = (ulong)uVar52;
      }
      auVar279._8_8_ = 0;
      auVar279._0_8_ = auStack_58[uVar55];
      auVar284 = ZEXT1664(auVar279);
      auStack_408[uVar55] = uVar58;
      fVar149 = (float)(iVar53 + 1) * 0.14285715;
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * (float)iVar53 * 0.14285715)),ZEXT416(uVar51)
                               ,ZEXT416((uint)(1.0 - (float)iVar53 * 0.14285715)));
      auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar149)),ZEXT416(uVar51),
                                ZEXT416((uint)(1.0 - fVar149)));
      fVar149 = auVar70._0_4_;
      fVar150 = auVar7._0_4_;
      fVar133 = fVar149 - fVar150;
      if (0.16666667 <= fVar133) break;
      auVar273 = vshufps_avx(auVar279,auVar279,0x50);
      auVar94._8_4_ = 0x3f800000;
      auVar94._0_8_ = &DAT_3f8000003f800000;
      auVar94._12_4_ = 0x3f800000;
      auVar66 = vsubps_avx(auVar94,auVar273);
      fVar151 = auVar273._0_4_;
      auVar108._0_4_ = fVar151 * (float)local_448._0_4_;
      fVar91 = auVar273._4_4_;
      auVar108._4_4_ = fVar91 * (float)local_448._4_4_;
      fVar74 = auVar273._8_4_;
      auVar108._8_4_ = fVar74 * fStack_440;
      fVar134 = auVar273._12_4_;
      auVar108._12_4_ = fVar134 * fStack_43c;
      auVar121._0_4_ = fVar151 * (float)local_458._0_4_;
      auVar121._4_4_ = fVar91 * (float)local_458._4_4_;
      auVar121._8_4_ = fVar74 * fStack_450;
      auVar121._12_4_ = fVar134 * fStack_44c;
      auVar142._0_4_ = fVar151 * (float)local_468._0_4_;
      auVar142._4_4_ = fVar91 * (float)local_468._4_4_;
      auVar142._8_4_ = fVar74 * fStack_460;
      auVar142._12_4_ = fVar134 * fStack_45c;
      auVar82._0_4_ = fVar151 * (float)local_478._0_4_;
      auVar82._4_4_ = fVar91 * (float)local_478._4_4_;
      auVar82._8_4_ = fVar74 * fStack_470;
      auVar82._12_4_ = fVar134 * fStack_46c;
      auVar273 = vfmadd231ps_fma(auVar108,auVar66,auVar259);
      auVar65 = vfmadd231ps_fma(auVar121,auVar66,local_418);
      auVar92 = vfmadd231ps_fma(auVar142,auVar66,local_428);
      auVar66 = vfmadd231ps_fma(auVar82,auVar66,local_438);
      auVar105._16_16_ = auVar273;
      auVar105._0_16_ = auVar273;
      auVar115._16_16_ = auVar65;
      auVar115._0_16_ = auVar65;
      auVar132._16_16_ = auVar92;
      auVar132._0_16_ = auVar92;
      auVar172._4_4_ = fVar150;
      auVar172._0_4_ = fVar150;
      auVar172._8_4_ = fVar150;
      auVar172._12_4_ = fVar150;
      auVar172._20_4_ = fVar149;
      auVar172._16_4_ = fVar149;
      auVar172._24_4_ = fVar149;
      auVar172._28_4_ = fVar149;
      auVar72 = vsubps_avx(auVar115,auVar105);
      auVar65 = vfmadd213ps_fma(auVar72,auVar172,auVar105);
      auVar72 = vsubps_avx(auVar132,auVar115);
      auVar76 = vfmadd213ps_fma(auVar72,auVar172,auVar115);
      auVar273 = vsubps_avx(auVar66,auVar92);
      auVar116._16_16_ = auVar273;
      auVar116._0_16_ = auVar273;
      auVar273 = vfmadd213ps_fma(auVar116,auVar172,auVar132);
      auVar72 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar65));
      auVar66 = vfmadd213ps_fma(auVar72,auVar172,ZEXT1632(auVar65));
      auVar72 = vsubps_avx(ZEXT1632(auVar273),ZEXT1632(auVar76));
      auVar273 = vfmadd213ps_fma(auVar72,auVar172,ZEXT1632(auVar76));
      auVar72 = vsubps_avx(ZEXT1632(auVar273),ZEXT1632(auVar66));
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar72,auVar172);
      fVar152 = auVar72._4_4_ * 3.0;
      fVar117 = fVar133 * 0.33333334;
      local_2a8._0_8_ =
           CONCAT44(auVar106._4_4_ + fVar117 * fVar152,
                    auVar106._0_4_ + fVar117 * auVar72._0_4_ * 3.0);
      local_2a8._8_4_ = auVar106._8_4_ + fVar117 * auVar72._8_4_ * 3.0;
      local_2a8._12_4_ = auVar106._12_4_ + fVar117 * auVar72._12_4_ * 3.0;
      auVar66 = vshufpd_avx(auVar106,auVar106,3);
      auVar65 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar273 = vsubps_avx(auVar66,auVar106);
      auVar92 = vsubps_avx(auVar65,(undefined1  [16])0x0);
      auVar95._0_4_ = auVar273._0_4_ + auVar92._0_4_;
      auVar95._4_4_ = auVar273._4_4_ + auVar92._4_4_;
      auVar95._8_4_ = auVar273._8_4_ + auVar92._8_4_;
      auVar95._12_4_ = auVar273._12_4_ + auVar92._12_4_;
      auVar273 = vshufps_avx(auVar106,auVar106,0xb1);
      auVar92 = vshufps_avx(local_2a8._0_16_,local_2a8._0_16_,0xb1);
      auVar260._4_4_ = auVar95._0_4_;
      auVar260._0_4_ = auVar95._0_4_;
      auVar260._8_4_ = auVar95._0_4_;
      auVar260._12_4_ = auVar95._0_4_;
      auVar76 = vshufps_avx(auVar95,auVar95,0x55);
      fVar151 = auVar76._0_4_;
      auVar187._0_4_ = auVar273._0_4_ * fVar151;
      fVar91 = auVar76._4_4_;
      auVar187._4_4_ = auVar273._4_4_ * fVar91;
      fVar74 = auVar76._8_4_;
      auVar187._8_4_ = auVar273._8_4_ * fVar74;
      fVar134 = auVar76._12_4_;
      auVar187._12_4_ = auVar273._12_4_ * fVar134;
      auVar199._0_4_ = auVar92._0_4_ * fVar151;
      auVar199._4_4_ = auVar92._4_4_ * fVar91;
      auVar199._8_4_ = auVar92._8_4_ * fVar74;
      auVar199._12_4_ = auVar92._12_4_ * fVar134;
      auVar201 = vfmadd231ps_fma(auVar187,auVar260,auVar106);
      auVar77 = vfmadd231ps_fma(auVar199,auVar260,local_2a8._0_16_);
      auVar92 = vshufps_avx(auVar201,auVar201,0xe8);
      auVar76 = vshufps_avx(auVar77,auVar77,0xe8);
      auVar273 = vcmpps_avx(auVar92,auVar76,1);
      uVar51 = vextractps_avx(auVar273,0);
      auVar119 = auVar77;
      if ((uVar51 & 1) == 0) {
        auVar119 = auVar201;
      }
      auVar122._0_4_ = fVar117 * auVar72._16_4_ * 3.0;
      auVar122._4_4_ = fVar117 * fVar152;
      auVar122._8_4_ = fVar117 * auVar72._24_4_ * 3.0;
      auVar122._12_4_ = fVar117 * fVar149;
      auVar135 = vsubps_avx((undefined1  [16])0x0,auVar122);
      auVar123 = vshufps_avx(auVar135,auVar135,0xb1);
      auVar75 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar280._0_4_ = auVar123._0_4_ * fVar151;
      auVar280._4_4_ = auVar123._4_4_ * fVar91;
      auVar280._8_4_ = auVar123._8_4_ * fVar74;
      auVar280._12_4_ = auVar123._12_4_ * fVar134;
      auVar96._0_4_ = auVar75._0_4_ * fVar151;
      auVar96._4_4_ = auVar75._4_4_ * fVar91;
      auVar96._8_4_ = auVar75._8_4_ * fVar74;
      auVar96._12_4_ = auVar75._12_4_ * fVar134;
      auVar136 = vfmadd231ps_fma(auVar280,auVar260,auVar135);
      auVar137 = vfmadd231ps_fma(auVar96,(undefined1  [16])0x0,auVar260);
      auVar75 = vshufps_avx(auVar136,auVar136,0xe8);
      auVar118 = vshufps_avx(auVar137,auVar137,0xe8);
      auVar123 = vcmpps_avx(auVar75,auVar118,1);
      uVar51 = vextractps_avx(auVar123,0);
      auVar183 = auVar137;
      if ((uVar51 & 1) == 0) {
        auVar183 = auVar136;
      }
      auVar119 = vmaxss_avx(auVar183,auVar119);
      auVar92 = vminps_avx(auVar92,auVar76);
      auVar76 = vminps_avx(auVar75,auVar118);
      auVar76 = vminps_avx(auVar92,auVar76);
      auVar273 = vshufps_avx(auVar273,auVar273,0x55);
      auVar273 = vblendps_avx(auVar273,auVar123,2);
      auVar123 = vpslld_avx(auVar273,0x1f);
      auVar273 = vshufpd_avx(auVar77,auVar77,1);
      auVar273 = vinsertps_avx(auVar273,auVar137,0x9c);
      auVar92 = vshufpd_avx(auVar201,auVar201,1);
      auVar92 = vinsertps_avx(auVar92,auVar136,0x9c);
      auVar273 = vblendvps_avx(auVar92,auVar273,auVar123);
      auVar92 = vmovshdup_avx(auVar273);
      auVar273 = vmaxss_avx(auVar92,auVar273);
      fVar74 = auVar76._0_4_;
      auVar92 = vmovshdup_avx(auVar76);
      fVar91 = auVar273._0_4_;
      fVar151 = auVar119._0_4_;
      if ((0.0001 <= fVar74) || (fVar91 <= -0.0001)) {
        auVar201 = vcmpps_avx(auVar92,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar77 = vcmpps_avx(auVar76,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar201 = vorps_avx(auVar77,auVar201);
        if ((-0.0001 < fVar151 & auVar201[0]) != 0) goto LAB_01658087;
        auVar201 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar273,5);
        auVar77 = vcmpps_avx(auVar92,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar201 = vorps_avx(auVar77,auVar201);
        if ((auVar201 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_01658087;
        bVar40 = true;
      }
      else {
LAB_01658087:
        auVar77 = vcmpps_avx(auVar76,_DAT_01feba10,1);
        auVar123 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar201 = vcmpss_avx(auVar119,ZEXT816(0) << 0x20,1);
        auVar143._8_4_ = 0x3f800000;
        auVar143._0_8_ = &DAT_3f8000003f800000;
        auVar143._12_4_ = 0x3f800000;
        auVar200._8_4_ = 0xbf800000;
        auVar200._0_8_ = 0xbf800000bf800000;
        auVar200._12_4_ = 0xbf800000;
        auVar201 = vblendvps_avx(auVar143,auVar200,auVar201);
        auVar77 = vblendvps_avx(auVar143,auVar200,auVar77);
        fVar134 = auVar77._0_4_;
        fVar117 = auVar201._0_4_;
        auVar201 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar75 = ZEXT816(0) << 0x20;
        if ((fVar134 == fVar117) && (!NAN(fVar134) && !NAN(fVar117))) {
          auVar201 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar134 == fVar117) && (!NAN(fVar134) && !NAN(fVar117))) {
          auVar123 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar77 = vmovshdup_avx(auVar77);
        fVar152 = auVar77._0_4_;
        if ((fVar134 != fVar152) || (NAN(fVar134) || NAN(fVar152))) {
          fVar134 = auVar92._0_4_;
          if ((fVar134 != fVar74) || (NAN(fVar134) || NAN(fVar74))) {
            auVar97._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
            auVar97._8_4_ = auVar76._8_4_ ^ 0x80000000;
            auVar97._12_4_ = auVar76._12_4_ ^ 0x80000000;
            auVar124._0_4_ = -fVar74 / (fVar134 - fVar74);
            auVar124._4_12_ = auVar97._4_12_;
            auVar92 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar124._0_4_)),auVar75,auVar124);
            auVar76 = auVar92;
          }
          else {
            auVar92 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar74 == 0.0) && (auVar92 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar74))) {
              auVar92 = ZEXT816(0);
            }
            auVar76 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar74 == 0.0) && (auVar76 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar74))) {
              auVar76 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar201 = vminss_avx(auVar201,auVar92);
          auVar123 = vmaxss_avx(auVar76,auVar123);
        }
        auVar273 = vcmpss_avx(auVar273,auVar75,1);
        auVar125._8_4_ = 0x3f800000;
        auVar125._0_8_ = &DAT_3f8000003f800000;
        auVar125._12_4_ = 0x3f800000;
        auVar144._8_4_ = 0xbf800000;
        auVar144._0_8_ = 0xbf800000bf800000;
        auVar144._12_4_ = 0xbf800000;
        auVar273 = vblendvps_avx(auVar125,auVar144,auVar273);
        fVar74 = auVar273._0_4_;
        auVar273 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar117 != fVar74) || (NAN(fVar117) || NAN(fVar74))) {
          if ((fVar91 != fVar151) || (NAN(fVar91) || NAN(fVar151))) {
            auVar98._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
            auVar98._8_4_ = auVar119._8_4_ ^ 0x80000000;
            auVar98._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar126._0_4_ = -fVar151 / (fVar91 - fVar151);
            auVar126._4_12_ = auVar98._4_12_;
            auVar92 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar75,auVar126);
            auVar76 = auVar92;
          }
          else {
            auVar92 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar151 == 0.0) && (auVar92 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar151))) {
              auVar92 = ZEXT816(0);
            }
            auVar76 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar151 == 0.0) && (auVar76 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar151))) {
              auVar76 = auVar273;
            }
          }
          auVar201 = vminss_avx(auVar201,auVar92);
          auVar123 = vmaxss_avx(auVar76,auVar123);
        }
        if ((fVar152 != fVar74) || (NAN(fVar152) || NAN(fVar74))) {
          auVar201 = vminss_avx(auVar201,auVar273);
          auVar123 = vmaxss_avx(auVar273,auVar123);
        }
        auVar92 = vmaxss_avx(auVar75,auVar201);
        auVar76 = vminss_avx(auVar123,auVar273);
        bVar40 = true;
        if (auVar92._0_4_ <= auVar76._0_4_) {
          auVar92 = vmaxss_avx(auVar75,ZEXT416((uint)(auVar92._0_4_ + -0.1)));
          auVar273 = vminss_avx(ZEXT416((uint)(auVar76._0_4_ + 0.1)),auVar273);
          auVar83._0_8_ = auVar106._0_8_;
          auVar83._8_8_ = auVar83._0_8_;
          auVar202._8_8_ = local_2a8._0_8_;
          auVar202._0_8_ = local_2a8._0_8_;
          auVar216._8_8_ = auVar135._0_8_;
          auVar216._0_8_ = auVar135._0_8_;
          auVar76 = vshufpd_avx(local_2a8._0_16_,local_2a8._0_16_,3);
          auVar201 = vshufpd_avx(auVar135,auVar135,3);
          auVar77 = vshufps_avx(auVar92,auVar273,0);
          auVar109._8_4_ = 0x3f800000;
          auVar109._0_8_ = &DAT_3f8000003f800000;
          auVar109._12_4_ = 0x3f800000;
          auVar106 = vsubps_avx(auVar109,auVar77);
          local_5c8._0_4_ = auVar66._0_4_;
          local_5c8._4_4_ = auVar66._4_4_;
          fStack_5c0 = auVar66._8_4_;
          fStack_5bc = auVar66._12_4_;
          fVar151 = auVar77._0_4_;
          auVar110._0_4_ = fVar151 * (float)local_5c8._0_4_;
          fVar91 = auVar77._4_4_;
          auVar110._4_4_ = fVar91 * (float)local_5c8._4_4_;
          fVar74 = auVar77._8_4_;
          auVar110._8_4_ = fVar74 * fStack_5c0;
          fVar134 = auVar77._12_4_;
          auVar110._12_4_ = fVar134 * fStack_5bc;
          auVar127._0_4_ = auVar76._0_4_ * fVar151;
          auVar127._4_4_ = auVar76._4_4_ * fVar91;
          auVar127._8_4_ = auVar76._8_4_ * fVar74;
          auVar127._12_4_ = auVar76._12_4_ * fVar134;
          auVar145._0_4_ = auVar201._0_4_ * fVar151;
          auVar145._4_4_ = auVar201._4_4_ * fVar91;
          auVar145._8_4_ = auVar201._8_4_ * fVar74;
          auVar145._12_4_ = auVar201._12_4_ * fVar134;
          local_5f8._0_4_ = auVar65._0_4_;
          local_5f8._4_4_ = auVar65._4_4_;
          uStack_5f0._0_4_ = auVar65._8_4_;
          uStack_5f0._4_4_ = auVar65._12_4_;
          auVar167._0_4_ = fVar151 * (float)local_5f8._0_4_;
          auVar167._4_4_ = fVar91 * (float)local_5f8._4_4_;
          auVar167._8_4_ = fVar74 * (float)uStack_5f0;
          auVar167._12_4_ = fVar134 * uStack_5f0._4_4_;
          auVar76 = vfmadd231ps_fma(auVar110,auVar106,auVar83);
          auVar201 = vfmadd231ps_fma(auVar127,auVar106,auVar202);
          auVar77 = vfmadd231ps_fma(auVar145,auVar106,auVar216);
          auVar106 = vfmadd231ps_fma(auVar167,auVar106,ZEXT816(0));
          auVar66 = vmovshdup_avx(auVar279);
          auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar92._0_4_)),auVar279,
                                    ZEXT416((uint)(1.0 - auVar92._0_4_)));
          auVar118 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar273._0_4_)),auVar279,
                                     ZEXT416((uint)(1.0 - auVar273._0_4_)));
          fVar151 = 1.0 / fVar133;
          auVar273 = vsubps_avx(auVar201,auVar76);
          auVar188._0_4_ = auVar273._0_4_ * 3.0;
          auVar188._4_4_ = auVar273._4_4_ * 3.0;
          auVar188._8_4_ = auVar273._8_4_ * 3.0;
          auVar188._12_4_ = auVar273._12_4_ * 3.0;
          auVar273 = vsubps_avx(auVar77,auVar201);
          auVar203._0_4_ = auVar273._0_4_ * 3.0;
          auVar203._4_4_ = auVar273._4_4_ * 3.0;
          auVar203._8_4_ = auVar273._8_4_ * 3.0;
          auVar203._12_4_ = auVar273._12_4_ * 3.0;
          auVar273 = vsubps_avx(auVar106,auVar77);
          auVar217._0_4_ = auVar273._0_4_ * 3.0;
          auVar217._4_4_ = auVar273._4_4_ * 3.0;
          auVar217._8_4_ = auVar273._8_4_ * 3.0;
          auVar217._12_4_ = auVar273._12_4_ * 3.0;
          auVar66 = vminps_avx(auVar203,auVar217);
          auVar273 = vmaxps_avx(auVar203,auVar217);
          auVar66 = vminps_avx(auVar188,auVar66);
          auVar273 = vmaxps_avx(auVar188,auVar273);
          auVar65 = vshufpd_avx(auVar66,auVar66,3);
          auVar92 = vshufpd_avx(auVar273,auVar273,3);
          auVar66 = vminps_avx(auVar66,auVar65);
          auVar273 = vmaxps_avx(auVar273,auVar92);
          auVar204._0_4_ = auVar66._0_4_ * fVar151;
          auVar204._4_4_ = auVar66._4_4_ * fVar151;
          auVar204._8_4_ = auVar66._8_4_ * fVar151;
          auVar204._12_4_ = auVar66._12_4_ * fVar151;
          auVar189._0_4_ = fVar151 * auVar273._0_4_;
          auVar189._4_4_ = fVar151 * auVar273._4_4_;
          auVar189._8_4_ = fVar151 * auVar273._8_4_;
          auVar189._12_4_ = fVar151 * auVar273._12_4_;
          fVar151 = 1.0 / (auVar118._0_4_ - auVar75._0_4_);
          auVar273 = vshufpd_avx(auVar76,auVar76,3);
          auVar66 = vshufpd_avx(auVar201,auVar201,3);
          auVar65 = vshufpd_avx(auVar77,auVar77,3);
          auVar92 = vshufpd_avx(auVar106,auVar106,3);
          auVar273 = vsubps_avx(auVar273,auVar76);
          auVar76 = vsubps_avx(auVar66,auVar201);
          auVar201 = vsubps_avx(auVar65,auVar77);
          auVar92 = vsubps_avx(auVar92,auVar106);
          auVar66 = vminps_avx(auVar273,auVar76);
          auVar273 = vmaxps_avx(auVar273,auVar76);
          auVar65 = vminps_avx(auVar201,auVar92);
          auVar65 = vminps_avx(auVar66,auVar65);
          auVar66 = vmaxps_avx(auVar201,auVar92);
          auVar273 = vmaxps_avx(auVar273,auVar66);
          auVar237._0_4_ = fVar151 * auVar65._0_4_;
          auVar237._4_4_ = fVar151 * auVar65._4_4_;
          auVar237._8_4_ = fVar151 * auVar65._8_4_;
          auVar237._12_4_ = fVar151 * auVar65._12_4_;
          auVar225._0_4_ = fVar151 * auVar273._0_4_;
          auVar225._4_4_ = fVar151 * auVar273._4_4_;
          auVar225._8_4_ = fVar151 * auVar273._8_4_;
          auVar225._12_4_ = fVar151 * auVar273._12_4_;
          auVar92 = vinsertps_avx(auVar7,auVar75,0x10);
          auVar76 = vinsertps_avx(auVar70,auVar118,0x10);
          auVar69._0_4_ = (auVar92._0_4_ + auVar76._0_4_) * 0.5;
          auVar69._4_4_ = (auVar92._4_4_ + auVar76._4_4_) * 0.5;
          auVar69._8_4_ = (auVar92._8_4_ + auVar76._8_4_) * 0.5;
          auVar69._12_4_ = (auVar92._12_4_ + auVar76._12_4_) * 0.5;
          auVar111._4_4_ = auVar69._0_4_;
          auVar111._0_4_ = auVar69._0_4_;
          auVar111._8_4_ = auVar69._0_4_;
          auVar111._12_4_ = auVar69._0_4_;
          auVar273 = vfmadd213ps_fma(local_2b8,auVar111,auVar8);
          auVar66 = vfmadd213ps_fma(local_2c8,auVar111,auVar9);
          auVar65 = vfmadd213ps_fma(local_2d8,auVar111,auVar10);
          auVar70 = vsubps_avx(auVar66,auVar273);
          auVar273 = vfmadd213ps_fma(auVar70,auVar111,auVar273);
          auVar70 = vsubps_avx(auVar65,auVar66);
          auVar70 = vfmadd213ps_fma(auVar70,auVar111,auVar66);
          auVar70 = vsubps_avx(auVar70,auVar273);
          auVar273 = vfmadd231ps_fma(auVar273,auVar70,auVar111);
          auVar112._0_8_ = CONCAT44(auVar70._4_4_ * 3.0,auVar70._0_4_ * 3.0);
          auVar112._8_4_ = auVar70._8_4_ * 3.0;
          auVar112._12_4_ = auVar70._12_4_ * 3.0;
          auVar218._8_8_ = auVar273._0_8_;
          auVar218._0_8_ = auVar273._0_8_;
          auVar70 = vshufpd_avx(auVar273,auVar273,3);
          auVar273 = vshufps_avx(auVar69,auVar69,0x55);
          auVar201 = vsubps_avx(auVar70,auVar218);
          auVar106 = vfmadd231ps_fma(auVar218,auVar273,auVar201);
          auVar261._8_8_ = auVar112._0_8_;
          auVar261._0_8_ = auVar112._0_8_;
          auVar70 = vshufpd_avx(auVar112,auVar112,3);
          auVar70 = vsubps_avx(auVar70,auVar261);
          auVar77 = vfmadd213ps_fma(auVar70,auVar273,auVar261);
          auVar273 = vmovshdup_avx(auVar77);
          auVar262._0_8_ = auVar273._0_8_ ^ 0x8000000080000000;
          auVar262._8_4_ = auVar273._8_4_ ^ 0x80000000;
          auVar262._12_4_ = auVar273._12_4_ ^ 0x80000000;
          auVar66 = vmovshdup_avx(auVar201);
          auVar70 = vunpcklps_avx(auVar66,auVar262);
          auVar65 = vshufps_avx(auVar70,auVar262,4);
          auVar281._0_8_ = auVar201._0_8_ ^ 0x8000000080000000;
          auVar281._8_4_ = auVar201._8_4_ ^ 0x80000000;
          auVar281._12_4_ = auVar201._12_4_ ^ 0x80000000;
          auVar70 = vmovlhps_avx(auVar281,auVar77);
          auVar70 = vshufps_avx(auVar70,auVar77,8);
          auVar273 = vfmsub231ss_fma(ZEXT416((uint)(auVar273._0_4_ * auVar201._0_4_)),auVar66,
                                     auVar77);
          auVar128._0_4_ = auVar273._0_4_;
          auVar128._4_4_ = auVar128._0_4_;
          auVar128._8_4_ = auVar128._0_4_;
          auVar128._12_4_ = auVar128._0_4_;
          auVar273 = vdivps_avx(auVar65,auVar128);
          auVar66 = vdivps_avx(auVar70,auVar128);
          fVar74 = auVar106._0_4_;
          fVar151 = auVar273._0_4_;
          auVar70 = vshufps_avx(auVar106,auVar106,0x55);
          fVar91 = auVar66._0_4_;
          local_5f8._4_4_ = fVar74 * auVar273._4_4_ + auVar70._4_4_ * auVar66._4_4_;
          local_5f8._0_4_ = fVar74 * fVar151 + auVar70._0_4_ * fVar91;
          uStack_5f0._0_4_ = fVar74 * auVar273._8_4_ + auVar70._8_4_ * auVar66._8_4_;
          uStack_5f0._4_4_ = fVar74 * auVar273._12_4_ + auVar70._12_4_ * auVar66._12_4_;
          auVar201 = vmovshdup_avx(auVar273);
          auVar70 = vinsertps_avx(auVar204,auVar237,0x1c);
          auVar274._0_4_ = auVar201._0_4_ * auVar70._0_4_;
          auVar274._4_4_ = auVar201._4_4_ * auVar70._4_4_;
          auVar274._8_4_ = auVar201._8_4_ * auVar70._8_4_;
          auVar274._12_4_ = auVar201._12_4_ * auVar70._12_4_;
          auVar65 = vinsertps_avx(auVar189,auVar225,0x1c);
          auVar247._0_4_ = auVar201._0_4_ * auVar65._0_4_;
          auVar247._4_4_ = auVar201._4_4_ * auVar65._4_4_;
          auVar247._8_4_ = auVar201._8_4_ * auVar65._8_4_;
          auVar247._12_4_ = auVar201._12_4_ * auVar65._12_4_;
          auVar119 = vminps_avx(auVar274,auVar247);
          auVar106 = vmaxps_avx(auVar247,auVar274);
          auVar201 = vinsertps_avx(auVar237,auVar204,0x4c);
          auVar123 = vmovshdup_avx(auVar66);
          auVar77 = vinsertps_avx(auVar225,auVar189,0x4c);
          auVar226._0_4_ = auVar123._0_4_ * auVar201._0_4_;
          auVar226._4_4_ = auVar123._4_4_ * auVar201._4_4_;
          auVar226._8_4_ = auVar123._8_4_ * auVar201._8_4_;
          auVar226._12_4_ = auVar123._12_4_ * auVar201._12_4_;
          auVar238._0_4_ = auVar123._0_4_ * auVar77._0_4_;
          auVar238._4_4_ = auVar123._4_4_ * auVar77._4_4_;
          auVar238._8_4_ = auVar123._8_4_ * auVar77._8_4_;
          auVar238._12_4_ = auVar123._12_4_ * auVar77._12_4_;
          auVar123 = vminps_avx(auVar226,auVar238);
          auVar84._0_4_ = auVar123._0_4_ + auVar119._0_4_;
          auVar84._4_4_ = auVar123._4_4_ + auVar119._4_4_;
          auVar84._8_4_ = auVar123._8_4_ + auVar119._8_4_;
          auVar84._12_4_ = auVar123._12_4_ + auVar119._12_4_;
          auVar119 = vmaxps_avx(auVar238,auVar226);
          auVar227._0_4_ = auVar106._0_4_ + auVar119._0_4_;
          auVar227._4_4_ = auVar106._4_4_ + auVar119._4_4_;
          auVar227._8_4_ = auVar106._8_4_ + auVar119._8_4_;
          auVar227._12_4_ = auVar106._12_4_ + auVar119._12_4_;
          auVar239._8_8_ = 0x3f80000000000000;
          auVar239._0_8_ = 0x3f80000000000000;
          auVar106 = vsubps_avx(auVar239,auVar227);
          auVar119 = vsubps_avx(auVar239,auVar84);
          auVar123 = vsubps_avx(auVar92,auVar69);
          auVar263._0_4_ = fVar151 * auVar70._0_4_;
          auVar263._4_4_ = fVar151 * auVar70._4_4_;
          auVar263._8_4_ = fVar151 * auVar70._8_4_;
          auVar263._12_4_ = fVar151 * auVar70._12_4_;
          auVar248._0_4_ = fVar151 * auVar65._0_4_;
          auVar248._4_4_ = fVar151 * auVar65._4_4_;
          auVar248._8_4_ = fVar151 * auVar65._8_4_;
          auVar248._12_4_ = fVar151 * auVar65._12_4_;
          auVar65 = vminps_avx(auVar263,auVar248);
          auVar70 = vmaxps_avx(auVar248,auVar263);
          auVar205._0_4_ = fVar91 * auVar201._0_4_;
          auVar205._4_4_ = fVar91 * auVar201._4_4_;
          auVar205._8_4_ = fVar91 * auVar201._8_4_;
          auVar205._12_4_ = fVar91 * auVar201._12_4_;
          auVar190._0_4_ = fVar91 * auVar77._0_4_;
          auVar190._4_4_ = fVar91 * auVar77._4_4_;
          auVar190._8_4_ = fVar91 * auVar77._8_4_;
          auVar190._12_4_ = fVar91 * auVar77._12_4_;
          auVar201 = vminps_avx(auVar205,auVar190);
          auVar264._0_4_ = auVar65._0_4_ + auVar201._0_4_;
          auVar264._4_4_ = auVar65._4_4_ + auVar201._4_4_;
          auVar264._8_4_ = auVar65._8_4_ + auVar201._8_4_;
          auVar264._12_4_ = auVar65._12_4_ + auVar201._12_4_;
          auVar201 = vsubps_avx(auVar76,auVar69);
          auVar65 = vmaxps_avx(auVar190,auVar205);
          fVar74 = auVar123._0_4_;
          auVar206._0_4_ = fVar74 * auVar106._0_4_;
          fVar134 = auVar123._4_4_;
          auVar206._4_4_ = fVar134 * auVar106._4_4_;
          fVar117 = auVar123._8_4_;
          auVar206._8_4_ = fVar117 * auVar106._8_4_;
          fVar152 = auVar123._12_4_;
          auVar206._12_4_ = fVar152 * auVar106._12_4_;
          auVar191._0_4_ = auVar70._0_4_ + auVar65._0_4_;
          auVar191._4_4_ = auVar70._4_4_ + auVar65._4_4_;
          auVar191._8_4_ = auVar70._8_4_ + auVar65._8_4_;
          auVar191._12_4_ = auVar70._12_4_ + auVar65._12_4_;
          auVar249._8_8_ = 0x3f800000;
          auVar249._0_8_ = 0x3f800000;
          auVar70 = vsubps_avx(auVar249,auVar191);
          auVar65 = vsubps_avx(auVar249,auVar264);
          auVar265._0_4_ = fVar74 * auVar119._0_4_;
          auVar265._4_4_ = fVar134 * auVar119._4_4_;
          auVar265._8_4_ = fVar117 * auVar119._8_4_;
          auVar265._12_4_ = fVar152 * auVar119._12_4_;
          fVar153 = auVar201._0_4_;
          auVar228._0_4_ = fVar153 * auVar106._0_4_;
          fVar244 = auVar201._4_4_;
          auVar228._4_4_ = fVar244 * auVar106._4_4_;
          fVar255 = auVar201._8_4_;
          auVar228._8_4_ = fVar255 * auVar106._8_4_;
          fVar256 = auVar201._12_4_;
          auVar228._12_4_ = fVar256 * auVar106._12_4_;
          auVar85._0_4_ = fVar153 * auVar119._0_4_;
          auVar85._4_4_ = fVar244 * auVar119._4_4_;
          auVar85._8_4_ = fVar255 * auVar119._8_4_;
          auVar85._12_4_ = fVar256 * auVar119._12_4_;
          auVar282._0_4_ = fVar74 * auVar70._0_4_;
          auVar282._4_4_ = fVar134 * auVar70._4_4_;
          auVar282._8_4_ = fVar117 * auVar70._8_4_;
          auVar282._12_4_ = fVar152 * auVar70._12_4_;
          auVar240._0_4_ = fVar74 * auVar65._0_4_;
          auVar240._4_4_ = fVar134 * auVar65._4_4_;
          auVar240._8_4_ = fVar117 * auVar65._8_4_;
          auVar240._12_4_ = fVar152 * auVar65._12_4_;
          auVar192._0_4_ = fVar153 * auVar70._0_4_;
          auVar192._4_4_ = fVar244 * auVar70._4_4_;
          auVar192._8_4_ = fVar255 * auVar70._8_4_;
          auVar192._12_4_ = fVar256 * auVar70._12_4_;
          auVar250._0_4_ = fVar153 * auVar65._0_4_;
          auVar250._4_4_ = fVar244 * auVar65._4_4_;
          auVar250._8_4_ = fVar255 * auVar65._8_4_;
          auVar250._12_4_ = fVar256 * auVar65._12_4_;
          auVar70 = vminps_avx(auVar282,auVar240);
          auVar65 = vminps_avx(auVar192,auVar250);
          auVar70 = vminps_avx(auVar70,auVar65);
          auVar65 = vmaxps_avx(auVar240,auVar282);
          auVar201 = vminps_avx(auVar206,auVar265);
          auVar77 = vminps_avx(auVar228,auVar85);
          auVar201 = vminps_avx(auVar201,auVar77);
          auVar70 = vhaddps_avx(auVar70,auVar201);
          auVar201 = vmaxps_avx(auVar250,auVar192);
          auVar65 = vmaxps_avx(auVar201,auVar65);
          auVar201 = vmaxps_avx(auVar265,auVar206);
          auVar77 = vmaxps_avx(auVar85,auVar228);
          auVar201 = vmaxps_avx(auVar77,auVar201);
          auVar65 = vhaddps_avx(auVar65,auVar201);
          auVar201 = vshufps_avx(auVar69,auVar69,0x54);
          auVar201 = vsubps_avx(auVar201,_local_5f8);
          auVar70 = vshufps_avx(auVar70,auVar70,0xe8);
          auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
          auVar207._0_4_ = auVar201._0_4_ + auVar70._0_4_;
          auVar207._4_4_ = auVar201._4_4_ + auVar70._4_4_;
          auVar207._8_4_ = auVar201._8_4_ + auVar70._8_4_;
          auVar207._12_4_ = auVar201._12_4_ + auVar70._12_4_;
          auVar193._0_4_ = auVar201._0_4_ + auVar65._0_4_;
          auVar193._4_4_ = auVar201._4_4_ + auVar65._4_4_;
          auVar193._8_4_ = auVar201._8_4_ + auVar65._8_4_;
          auVar193._12_4_ = auVar201._12_4_ + auVar65._12_4_;
          auVar70 = vmaxps_avx(auVar92,auVar207);
          auVar65 = vminps_avx(auVar193,auVar76);
          auVar70 = vcmpps_avx(auVar65,auVar70,1);
          auVar70 = vshufps_avx(auVar70,auVar70,0x50);
          auVar279 = vinsertps_avx(auVar75,ZEXT416((uint)auVar118._0_4_),0x10);
          if ((auVar70 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              -1 < auVar70[0xf]) {
            bVar57 = 0;
            if ((fVar150 < auVar207._0_4_) && (bVar57 = 0, auVar193._0_4_ < auVar76._0_4_)) {
              auVar65 = vmovshdup_avx(auVar207);
              auVar70 = vcmpps_avx(auVar193,auVar76,1);
              bVar57 = auVar70[4] & auVar75._0_4_ < auVar65._0_4_;
            }
            if (((3 < (uint)uVar54 || fVar133 < 0.001) | bVar57) == 1) {
              lVar56 = 200;
              do {
                fVar134 = auVar201._0_4_;
                fVar74 = 1.0 - fVar134;
                fVar133 = fVar74 * fVar74 * fVar74;
                fVar150 = fVar134 * 3.0 * fVar74 * fVar74;
                fVar74 = fVar74 * fVar134 * fVar134 * 3.0;
                auVar146._4_4_ = fVar133;
                auVar146._0_4_ = fVar133;
                auVar146._8_4_ = fVar133;
                auVar146._12_4_ = fVar133;
                auVar99._4_4_ = fVar150;
                auVar99._0_4_ = fVar150;
                auVar99._8_4_ = fVar150;
                auVar99._12_4_ = fVar150;
                auVar86._4_4_ = fVar74;
                auVar86._0_4_ = fVar74;
                auVar86._8_4_ = fVar74;
                auVar86._12_4_ = fVar74;
                fVar134 = fVar134 * fVar134 * fVar134;
                auVar168._0_4_ = (float)local_2e8._0_4_ * fVar134;
                auVar168._4_4_ = (float)local_2e8._4_4_ * fVar134;
                auVar168._8_4_ = fStack_2e0 * fVar134;
                auVar168._12_4_ = fStack_2dc * fVar134;
                auVar70 = vfmadd231ps_fma(auVar168,auVar10,auVar86);
                auVar70 = vfmadd231ps_fma(auVar70,auVar9,auVar99);
                auVar70 = vfmadd231ps_fma(auVar70,auVar8,auVar146);
                auVar87._8_8_ = auVar70._0_8_;
                auVar87._0_8_ = auVar70._0_8_;
                auVar70 = vshufpd_avx(auVar70,auVar70,3);
                auVar65 = vshufps_avx(auVar201,auVar201,0x55);
                auVar70 = vsubps_avx(auVar70,auVar87);
                auVar65 = vfmadd213ps_fma(auVar70,auVar65,auVar87);
                fVar133 = auVar65._0_4_;
                auVar70 = vshufps_avx(auVar65,auVar65,0x55);
                auVar88._0_4_ = fVar151 * fVar133 + fVar91 * auVar70._0_4_;
                auVar88._4_4_ = auVar273._4_4_ * fVar133 + auVar66._4_4_ * auVar70._4_4_;
                auVar88._8_4_ = auVar273._8_4_ * fVar133 + auVar66._8_4_ * auVar70._8_4_;
                auVar88._12_4_ = auVar273._12_4_ * fVar133 + auVar66._12_4_ * auVar70._12_4_;
                auVar201 = vsubps_avx(auVar201,auVar88);
                auVar70 = vandps_avx(auVar182,auVar65);
                auVar65 = vshufps_avx(auVar70,auVar70,0xf5);
                auVar70 = vmaxss_avx(auVar65,auVar70);
                if (auVar70._0_4_ < fVar73) {
                  local_218 = auVar201._0_4_;
                  if (0.0 <= local_218) {
                    auVar284 = ZEXT1664(auVar279);
                    if (local_218 <= 1.0) {
                      auVar70 = vmovshdup_avx(auVar201);
                      fVar133 = auVar70._0_4_;
                      if ((0.0 <= fVar133) && (fVar133 <= 1.0)) {
                        auVar70 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar106 = vinsertps_avx(auVar70,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                       m128[2]),0x28);
                        auVar70 = vdpps_avx(auVar106,local_488,0x7f);
                        auVar273 = vdpps_avx(auVar106,local_498,0x7f);
                        auVar66 = vdpps_avx(auVar106,local_2f8,0x7f);
                        auVar65 = vdpps_avx(auVar106,local_308,0x7f);
                        auVar92 = vdpps_avx(auVar106,local_318,0x7f);
                        auVar76 = vdpps_avx(auVar106,local_328,0x7f);
                        auVar77 = vdpps_avx(auVar106,local_338,0x7f);
                        auVar106 = vdpps_avx(auVar106,local_348,0x7f);
                        fVar150 = 1.0 - fVar133;
                        auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * auVar92._0_4_)),
                                                  ZEXT416((uint)fVar150),auVar70);
                        auVar273 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * fVar133)),
                                                   ZEXT416((uint)fVar150),auVar273);
                        auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ * fVar133)),
                                                  ZEXT416((uint)fVar150),auVar66);
                        auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * auVar106._0_4_)),
                                                  ZEXT416((uint)fVar150),auVar65);
                        fVar91 = 1.0 - local_218;
                        fVar133 = fVar91 * local_218 * local_218 * 3.0;
                        fVar134 = local_218 * local_218 * local_218;
                        auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar134)),
                                                  ZEXT416((uint)fVar133),auVar66);
                        fVar150 = local_218 * 3.0 * fVar91 * fVar91;
                        auVar273 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar150),auVar273);
                        fVar151 = fVar91 * fVar91 * fVar91;
                        auVar70 = vfmadd231ss_fma(auVar273,ZEXT416((uint)fVar151),auVar70);
                        fVar74 = auVar70._0_4_;
                        if ((fVar63 <= fVar74) &&
                           (fVar117 = *(float *)(ray + k * 4 + 0x80), fVar74 <= fVar117)) {
                          pGVar3 = (context->scene->geometries).items[uVar50].ptr;
                          if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar62 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar62 = true,
                                  pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_208 = vshufps_avx(auVar201,auVar201,0x55);
                            auVar208._8_4_ = 0x3f800000;
                            auVar208._0_8_ = &DAT_3f8000003f800000;
                            auVar208._12_4_ = 0x3f800000;
                            auVar70 = vsubps_avx(auVar208,local_208);
                            fVar152 = local_208._0_4_;
                            auVar219._0_4_ = fVar152 * (float)local_4b8._0_4_;
                            fVar153 = local_208._4_4_;
                            auVar219._4_4_ = fVar153 * (float)local_4b8._4_4_;
                            fVar244 = local_208._8_4_;
                            auVar219._8_4_ = fVar244 * fStack_4b0;
                            fVar255 = local_208._12_4_;
                            auVar219._12_4_ = fVar255 * fStack_4ac;
                            auVar229._0_4_ = fVar152 * (float)local_4f8._0_4_;
                            auVar229._4_4_ = fVar153 * (float)local_4f8._4_4_;
                            auVar229._8_4_ = fVar244 * fStack_4f0;
                            auVar229._12_4_ = fVar255 * fStack_4ec;
                            auVar241._0_4_ = fVar152 * (float)local_508._0_4_;
                            auVar241._4_4_ = fVar153 * (float)local_508._4_4_;
                            auVar241._8_4_ = fVar244 * fStack_500;
                            auVar241._12_4_ = fVar255 * fStack_4fc;
                            auVar251._0_4_ = fVar152 * fVar154;
                            auVar251._4_4_ = fVar153 * fVar173;
                            auVar251._8_4_ = fVar244 * fVar175;
                            auVar251._12_4_ = fVar255 * fVar177;
                            auVar273 = vfmadd231ps_fma(auVar219,auVar70,local_4a8);
                            auVar66 = vfmadd231ps_fma(auVar229,auVar70,local_4d8);
                            auVar65 = vfmadd231ps_fma(auVar241,auVar70,local_4e8);
                            auVar92 = vfmadd231ps_fma(auVar251,auVar70,local_4c8);
                            auVar70 = vsubps_avx(auVar66,auVar273);
                            auVar273 = vsubps_avx(auVar65,auVar66);
                            auVar66 = vsubps_avx(auVar92,auVar65);
                            auVar242._0_4_ = auVar273._0_4_ * local_218;
                            auVar242._4_4_ = auVar273._4_4_ * local_218;
                            auVar242._8_4_ = auVar273._8_4_ * local_218;
                            auVar242._12_4_ = auVar273._12_4_ * local_218;
                            auVar169._4_4_ = fVar91;
                            auVar169._0_4_ = fVar91;
                            auVar169._8_4_ = fVar91;
                            auVar169._12_4_ = fVar91;
                            auVar70 = vfmadd231ps_fma(auVar242,auVar169,auVar70);
                            auVar209._0_4_ = auVar66._0_4_ * local_218;
                            auVar209._4_4_ = auVar66._4_4_ * local_218;
                            auVar209._8_4_ = auVar66._8_4_ * local_218;
                            auVar209._12_4_ = auVar66._12_4_ * local_218;
                            auVar273 = vfmadd231ps_fma(auVar209,auVar169,auVar273);
                            auVar210._0_4_ = auVar273._0_4_ * local_218;
                            auVar210._4_4_ = auVar273._4_4_ * local_218;
                            auVar210._8_4_ = auVar273._8_4_ * local_218;
                            auVar210._12_4_ = auVar273._12_4_ * local_218;
                            auVar273 = vfmadd231ps_fma(auVar210,auVar169,auVar70);
                            auVar147._0_4_ = fVar134 * (float)local_3c8._0_4_;
                            auVar147._4_4_ = fVar134 * (float)local_3c8._4_4_;
                            auVar147._8_4_ = fVar134 * fStack_3c0;
                            auVar147._12_4_ = fVar134 * fStack_3bc;
                            auVar100._4_4_ = fVar133;
                            auVar100._0_4_ = fVar133;
                            auVar100._8_4_ = fVar133;
                            auVar100._12_4_ = fVar133;
                            auVar70 = vfmadd132ps_fma(auVar100,auVar147,local_3b8);
                            auVar129._4_4_ = fVar150;
                            auVar129._0_4_ = fVar150;
                            auVar129._8_4_ = fVar150;
                            auVar129._12_4_ = fVar150;
                            auVar70 = vfmadd132ps_fma(auVar129,auVar70,local_3a8);
                            auVar101._0_4_ = auVar273._0_4_ * 3.0;
                            auVar101._4_4_ = auVar273._4_4_ * 3.0;
                            auVar101._8_4_ = auVar273._8_4_ * 3.0;
                            auVar101._12_4_ = auVar273._12_4_ * 3.0;
                            auVar113._4_4_ = fVar151;
                            auVar113._0_4_ = fVar151;
                            auVar113._8_4_ = fVar151;
                            auVar113._12_4_ = fVar151;
                            auVar273 = vfmadd132ps_fma(auVar113,auVar70,local_398);
                            auVar70 = vshufps_avx(auVar101,auVar101,0xc9);
                            auVar130._0_4_ = auVar273._0_4_ * auVar70._0_4_;
                            auVar130._4_4_ = auVar273._4_4_ * auVar70._4_4_;
                            auVar130._8_4_ = auVar273._8_4_ * auVar70._8_4_;
                            auVar130._12_4_ = auVar273._12_4_ * auVar70._12_4_;
                            auVar70 = vshufps_avx(auVar273,auVar273,0xc9);
                            auVar273 = vfmsub231ps_fma(auVar130,auVar101,auVar70);
                            auVar70 = vshufps_avx(auVar273,auVar273,0x55);
                            local_248[0] = (RTCHitN)auVar70[0];
                            local_248[1] = (RTCHitN)auVar70[1];
                            local_248[2] = (RTCHitN)auVar70[2];
                            local_248[3] = (RTCHitN)auVar70[3];
                            local_248[4] = (RTCHitN)auVar70[4];
                            local_248[5] = (RTCHitN)auVar70[5];
                            local_248[6] = (RTCHitN)auVar70[6];
                            local_248[7] = (RTCHitN)auVar70[7];
                            local_248[8] = (RTCHitN)auVar70[8];
                            local_248[9] = (RTCHitN)auVar70[9];
                            local_248[10] = (RTCHitN)auVar70[10];
                            local_248[0xb] = (RTCHitN)auVar70[0xb];
                            local_248[0xc] = (RTCHitN)auVar70[0xc];
                            local_248[0xd] = (RTCHitN)auVar70[0xd];
                            local_248[0xe] = (RTCHitN)auVar70[0xe];
                            local_248[0xf] = (RTCHitN)auVar70[0xf];
                            local_238 = vshufps_avx(auVar273,auVar273,0xaa);
                            local_228 = auVar273._0_4_;
                            uStack_224 = local_228;
                            uStack_220 = local_228;
                            uStack_21c = local_228;
                            fStack_214 = local_218;
                            fStack_210 = local_218;
                            fStack_20c = local_218;
                            local_1f8 = CONCAT44(uStack_384,local_388);
                            uStack_1f0 = CONCAT44(uStack_37c,uStack_380);
                            local_1e8._4_4_ = uStack_374;
                            local_1e8._0_4_ = local_378;
                            local_1e8._8_4_ = uStack_370;
                            local_1e8._12_4_ = uStack_36c;
                            vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                            uStack_1d4 = context->user->instID[0];
                            local_1d8 = uStack_1d4;
                            uStack_1d0 = uStack_1d4;
                            uStack_1cc = uStack_1d4;
                            uStack_1c8 = context->user->instPrimID[0];
                            uStack_1c4 = uStack_1c8;
                            uStack_1c0 = uStack_1c8;
                            uStack_1bc = uStack_1c8;
                            *(float *)(ray + k * 4 + 0x80) = fVar74;
                            local_528 = *local_510;
                            uStack_520 = local_510[1];
                            local_3f8.valid = (int *)&local_528;
                            local_3f8.geometryUserPtr = pGVar3->userPtr;
                            local_3f8.context = context->user;
                            local_3f8.ray = (RTCRayN *)ray;
                            local_3f8.hit = local_248;
                            local_3f8.N = 4;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar3->occlusionFilterN)(&local_3f8);
                            }
                            auVar45._8_8_ = uStack_520;
                            auVar45._0_8_ = local_528;
                            if (auVar45 == (undefined1  [16])0x0) {
                              auVar70 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                              auVar70 = auVar70 ^ _DAT_01febe20;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var4)(&local_3f8);
                              }
                              auVar46._8_8_ = uStack_520;
                              auVar46._0_8_ = local_528;
                              auVar273 = vpcmpeqd_avx((undefined1  [16])0x0,auVar46);
                              auVar70 = auVar273 ^ _DAT_01febe20;
                              auVar102._8_4_ = 0xff800000;
                              auVar102._0_8_ = 0xff800000ff800000;
                              auVar102._12_4_ = 0xff800000;
                              auVar273 = vblendvps_avx(auVar102,*(undefined1 (*) [16])
                                                                 (local_3f8.ray + 0x80),auVar273);
                              *(undefined1 (*) [16])(local_3f8.ray + 0x80) = auVar273;
                            }
                            auVar70 = vpslld_avx(auVar70,0x1f);
                            iVar53 = vmovmskps_avx(auVar70);
                            if (iVar53 == 0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar117;
                            }
                            bVar62 = (char)iVar53 != '\0';
                          }
                          auVar284 = ZEXT1664(auVar279);
                          bVar60 = (bool)(bVar60 | bVar62);
                        }
                      }
                    }
                    goto LAB_01658c17;
                  }
                  break;
                }
                lVar56 = lVar56 + -1;
              } while (lVar56 != 0);
            }
            else {
              bVar40 = false;
            }
          }
        }
      }
      auVar284 = ZEXT1664(auVar279);
LAB_01658c17:
    } while (bVar40);
    local_358 = vinsertps_avx(auVar7,ZEXT416((uint)fVar149),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }